

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O0

void fdct32_avx2(__m256i *input,__m256i *output,int8_t cos_bit,int instride,int outstride)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  uint uVar164;
  int32_t *piVar165;
  undefined8 *puVar166;
  int in_ECX;
  char in_DL;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  __m256i in1_w0_32;
  __m256i in0_w1_32;
  __m256i in1_w1_32;
  __m256i in0_w0_32;
  __m256i ww1_32;
  __m256i ww0_32;
  __m256i in1_w0_31;
  __m256i in0_w1_31;
  __m256i in1_w1_31;
  __m256i in0_w0_31;
  __m256i ww1_31;
  __m256i ww0_31;
  __m256i in1_w0_30;
  __m256i in0_w1_30;
  __m256i in1_w1_30;
  __m256i in0_w0_30;
  __m256i ww1_30;
  __m256i ww0_30;
  __m256i in1_w0_29;
  __m256i in0_w1_29;
  __m256i in1_w1_29;
  __m256i in0_w0_29;
  __m256i ww1_29;
  __m256i ww0_29;
  __m256i in1_w0_28;
  __m256i in0_w1_28;
  __m256i in1_w1_28;
  __m256i in0_w0_28;
  __m256i ww1_28;
  __m256i ww0_28;
  __m256i in1_w0_27;
  __m256i in0_w1_27;
  __m256i in1_w1_27;
  __m256i in0_w0_27;
  __m256i ww1_27;
  __m256i ww0_27;
  __m256i in1_w0_26;
  __m256i in0_w1_26;
  __m256i in1_w1_26;
  __m256i in0_w0_26;
  __m256i ww1_26;
  __m256i ww0_26;
  __m256i in1_w0_25;
  __m256i in0_w1_25;
  __m256i in1_w1_25;
  __m256i in0_w0_25;
  __m256i ww1_25;
  __m256i ww0_25;
  __m256i in1_w0_24;
  __m256i in0_w1_24;
  __m256i in1_w1_24;
  __m256i in0_w0_24;
  __m256i ww1_24;
  __m256i ww0_24;
  __m256i in1_w0_23;
  __m256i in0_w1_23;
  __m256i in1_w1_23;
  __m256i in0_w0_23;
  __m256i ww1_23;
  __m256i ww0_23;
  __m256i in1_w0_22;
  __m256i in0_w1_22;
  __m256i in1_w1_22;
  __m256i in0_w0_22;
  __m256i ww1_22;
  __m256i ww0_22;
  __m256i in1_w0_21;
  __m256i in0_w1_21;
  __m256i in1_w1_21;
  __m256i in0_w0_21;
  __m256i ww1_21;
  __m256i ww0_21;
  __m256i in1_w0_20;
  __m256i in0_w1_20;
  __m256i in1_w1_20;
  __m256i in0_w0_20;
  __m256i ww1_20;
  __m256i ww0_20;
  __m256i in1_w0_19;
  __m256i in0_w1_19;
  __m256i in1_w1_19;
  __m256i in0_w0_19;
  __m256i ww1_19;
  __m256i ww0_19;
  __m256i in1_w0_18;
  __m256i in0_w1_18;
  __m256i in1_w1_18;
  __m256i in0_w0_18;
  __m256i ww1_18;
  __m256i ww0_18;
  __m256i in1_w0_17;
  __m256i in0_w1_17;
  __m256i in1_w1_17;
  __m256i in0_w0_17;
  __m256i ww1_17;
  __m256i ww0_17;
  __m256i in1_w0_16;
  __m256i in0_w1_16;
  __m256i in1_w1_16;
  __m256i in0_w0_16;
  __m256i ww1_16;
  __m256i ww0_16;
  __m256i in1_w0_15;
  __m256i in0_w1_15;
  __m256i in1_w1_15;
  __m256i in0_w0_15;
  __m256i ww1_15;
  __m256i ww0_15;
  __m256i in1_w0_14;
  __m256i in0_w1_14;
  __m256i in1_w1_14;
  __m256i in0_w0_14;
  __m256i ww1_14;
  __m256i ww0_14;
  __m256i in1_w0_13;
  __m256i in0_w1_13;
  __m256i in1_w1_13;
  __m256i in0_w0_13;
  __m256i ww1_13;
  __m256i ww0_13;
  __m256i in1_w0_12;
  __m256i in0_w1_12;
  __m256i in1_w1_12;
  __m256i in0_w0_12;
  __m256i ww1_12;
  __m256i ww0_12;
  __m256i in1_w0_11;
  __m256i in0_w1_11;
  __m256i in1_w1_11;
  __m256i in0_w0_11;
  __m256i ww1_11;
  __m256i ww0_11;
  __m256i in1_w0_10;
  __m256i in0_w1_10;
  __m256i in1_w1_10;
  __m256i in0_w0_10;
  __m256i ww1_10;
  __m256i ww0_10;
  __m256i in1_w0_9;
  __m256i in0_w1_9;
  __m256i in1_w1_9;
  __m256i in0_w0_9;
  __m256i ww1_9;
  __m256i ww0_9;
  __m256i in1_w0_8;
  __m256i in0_w1_8;
  __m256i in1_w1_8;
  __m256i in0_w0_8;
  __m256i ww1_8;
  __m256i ww0_8;
  __m256i in1_w0_7;
  __m256i in0_w1_7;
  __m256i in1_w1_7;
  __m256i in0_w0_7;
  __m256i ww1_7;
  __m256i ww0_7;
  __m256i in1_w0_6;
  __m256i in0_w1_6;
  __m256i in1_w1_6;
  __m256i in0_w0_6;
  __m256i ww1_6;
  __m256i ww0_6;
  __m256i in1_w0_5;
  __m256i in0_w1_5;
  __m256i in1_w1_5;
  __m256i in0_w0_5;
  __m256i ww1_5;
  __m256i ww0_5;
  __m256i in1_w0_4;
  __m256i in0_w1_4;
  __m256i in1_w1_4;
  __m256i in0_w0_4;
  __m256i ww1_4;
  __m256i ww0_4;
  __m256i in1_w0_3;
  __m256i in0_w1_3;
  __m256i in1_w1_3;
  __m256i in0_w0_3;
  __m256i ww1_3;
  __m256i ww0_3;
  __m256i in1_w0_2;
  __m256i in0_w1_2;
  __m256i in1_w1_2;
  __m256i in0_w0_2;
  __m256i ww1_2;
  __m256i ww0_2;
  __m256i in1_w0_1;
  __m256i in0_w1_1;
  __m256i in1_w1_1;
  __m256i in0_w0_1;
  __m256i ww1_1;
  __m256i ww0_1;
  __m256i in1_w0;
  __m256i in0_w1;
  __m256i in1_w1;
  __m256i in0_w0;
  __m256i ww1;
  __m256i ww0;
  int endidx;
  int startidx;
  int32_t *cospi;
  __m256i buf1 [32];
  __m256i buf0 [32];
  int in_stack_ffffffffffff7abc;
  uint uVar169;
  int in_stack_ffffffffffff7ac0;
  uint bit;
  int in_stack_ffffffffffff7ac4;
  uint size;
  undefined4 in_stack_ffffffffffff7ac8;
  undefined4 in_stack_ffffffffffff7acc;
  uint uVar170;
  undefined8 uStack_6b68;
  undefined8 uStack_6b48;
  undefined8 uStack_6b28;
  undefined8 uStack_6b08;
  undefined8 uStack_6af0;
  undefined8 uStack_6ad0;
  undefined8 uStack_6ab0;
  undefined8 uStack_6a90;
  undefined8 uStack_6a68;
  undefined8 uStack_6a48;
  undefined8 uStack_6a28;
  undefined8 uStack_6a08;
  undefined8 uStack_69e8;
  undefined8 uStack_69c8;
  undefined8 uStack_69a8;
  undefined8 uStack_6988;
  undefined8 local_6980;
  undefined8 uStack_6968;
  undefined8 local_6960;
  undefined8 uStack_6948;
  undefined8 local_6940;
  undefined8 uStack_6928;
  undefined8 local_6920;
  undefined8 uStack_6908;
  undefined8 local_6800;
  undefined8 uStack_67e8;
  undefined8 local_67e0;
  undefined8 uStack_67c8;
  undefined8 local_67c0;
  undefined8 uStack_67a8;
  undefined8 local_67a0;
  undefined8 uStack_6788;
  undefined8 local_6780;
  undefined8 uStack_6778;
  undefined8 uStack_6770;
  undefined8 local_6760;
  undefined8 uStack_6758;
  undefined8 uStack_6750;
  undefined8 local_6740;
  undefined8 uStack_6738;
  undefined8 uStack_6730;
  undefined8 local_6720;
  undefined8 uStack_6718;
  undefined8 uStack_6710;
  undefined8 local_6700;
  undefined8 uStack_66f8;
  undefined8 uStack_66e8;
  undefined8 local_66e0;
  undefined8 uStack_66d8;
  undefined8 uStack_66c8;
  undefined8 local_66c0;
  undefined8 uStack_66b8;
  undefined8 uStack_66a8;
  undefined8 local_66a0;
  undefined8 uStack_6698;
  undefined8 uStack_6688;
  undefined8 local_6680;
  undefined8 uStack_6678;
  undefined8 uStack_6670;
  undefined8 local_6660;
  undefined8 uStack_6658;
  undefined8 uStack_6650;
  undefined8 local_6640;
  undefined8 uStack_6638;
  undefined8 uStack_6630;
  undefined8 local_6620;
  undefined8 uStack_6618;
  undefined8 uStack_6610;
  undefined8 local_6600;
  undefined8 uStack_65f8;
  undefined8 uStack_65f0;
  undefined8 local_65e0;
  undefined8 uStack_65d8;
  undefined8 uStack_65d0;
  undefined8 local_65c0;
  undefined8 uStack_65b8;
  undefined8 uStack_65b0;
  undefined8 local_65a0;
  undefined8 uStack_6598;
  undefined8 uStack_6590;
  undefined8 local_6580;
  undefined8 uStack_6578;
  undefined8 uStack_6570;
  undefined8 uStack_6568;
  undefined8 local_6560;
  undefined8 uStack_6558;
  undefined8 uStack_6550;
  undefined8 uStack_6548;
  undefined8 local_6540;
  undefined8 uStack_6538;
  undefined8 uStack_6530;
  undefined8 uStack_6528;
  undefined8 local_6520;
  undefined8 uStack_6518;
  undefined8 uStack_6510;
  undefined8 uStack_6508;
  undefined8 local_6500;
  undefined8 uStack_64f8;
  undefined8 uStack_64f0;
  undefined8 uStack_64e8;
  undefined8 local_64e0;
  undefined8 uStack_64d8;
  undefined8 uStack_64d0;
  undefined8 uStack_64c8;
  undefined8 local_64c0;
  undefined8 uStack_64b8;
  undefined8 uStack_64b0;
  undefined8 uStack_64a8;
  undefined8 local_64a0;
  undefined8 uStack_6498;
  undefined8 uStack_6490;
  undefined8 uStack_6488;
  undefined8 local_6480;
  undefined8 uStack_6478;
  undefined8 uStack_6470;
  undefined8 uStack_6468;
  undefined8 local_6460;
  undefined8 uStack_6458;
  undefined8 uStack_6450;
  undefined8 uStack_6448;
  undefined8 local_6440;
  undefined8 uStack_6438;
  undefined8 uStack_6430;
  undefined8 uStack_6428;
  undefined8 local_6420;
  undefined8 uStack_6418;
  undefined8 uStack_6410;
  undefined8 uStack_6408;
  undefined8 local_6400;
  undefined8 uStack_63f8;
  undefined8 uStack_63f0;
  undefined8 uStack_63e8;
  undefined8 local_63e0;
  undefined8 uStack_63d8;
  undefined8 uStack_63d0;
  undefined8 uStack_63c8;
  undefined8 local_63c0;
  undefined8 uStack_63b8;
  undefined8 uStack_63b0;
  undefined8 uStack_63a8;
  undefined8 local_63a0;
  undefined8 uStack_6398;
  undefined8 uStack_6390;
  undefined8 uStack_6388;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  auVar3 = vpaddd_avx2(*in_RDI,in_RDI[in_ECX * 0x1f]);
  auVar20 = vpsubd_avx2(*in_RDI,in_RDI[in_ECX * 0x1f]);
  auVar4 = vpaddd_avx2(in_RDI[in_ECX],in_RDI[in_ECX * 0x1e]);
  auVar21 = vpsubd_avx2(in_RDI[in_ECX],in_RDI[in_ECX * 0x1e]);
  auVar5 = vpaddd_avx2(in_RDI[in_ECX * 2],in_RDI[in_ECX * 0x1d]);
  auVar22 = vpsubd_avx2(in_RDI[in_ECX * 2],in_RDI[in_ECX * 0x1d]);
  auVar6 = vpaddd_avx2(in_RDI[in_ECX * 3],in_RDI[in_ECX * 0x1c]);
  auVar23 = vpsubd_avx2(in_RDI[in_ECX * 3],in_RDI[in_ECX * 0x1c]);
  auVar7 = vpaddd_avx2(in_RDI[in_ECX * 4],in_RDI[in_ECX * 0x1b]);
  auVar24 = vpsubd_avx2(in_RDI[in_ECX * 4],in_RDI[in_ECX * 0x1b]);
  auVar8 = vpaddd_avx2(in_RDI[in_ECX * 5],in_RDI[in_ECX * 0x1a]);
  auVar25 = vpsubd_avx2(in_RDI[in_ECX * 5],in_RDI[in_ECX * 0x1a]);
  auVar9 = vpaddd_avx2(in_RDI[in_ECX * 6],in_RDI[in_ECX * 0x19]);
  auVar26 = vpsubd_avx2(in_RDI[in_ECX * 6],in_RDI[in_ECX * 0x19]);
  auVar10 = vpaddd_avx2(in_RDI[in_ECX * 7],in_RDI[in_ECX * 0x18]);
  auVar27 = vpsubd_avx2(in_RDI[in_ECX * 7],in_RDI[in_ECX * 0x18]);
  auVar11 = vpaddd_avx2(in_RDI[in_ECX * 8],in_RDI[in_ECX * 0x17]);
  auVar28 = vpsubd_avx2(in_RDI[in_ECX * 8],in_RDI[in_ECX * 0x17]);
  auVar12 = vpaddd_avx2(in_RDI[in_ECX * 9],in_RDI[in_ECX * 0x16]);
  auVar29 = vpsubd_avx2(in_RDI[in_ECX * 9],in_RDI[in_ECX * 0x16]);
  auVar13 = vpaddd_avx2(in_RDI[in_ECX * 10],in_RDI[in_ECX * 0x15]);
  auVar30 = vpsubd_avx2(in_RDI[in_ECX * 10],in_RDI[in_ECX * 0x15]);
  auVar14 = vpaddd_avx2(in_RDI[in_ECX * 0xb],in_RDI[in_ECX * 0x14]);
  auVar31 = vpsubd_avx2(in_RDI[in_ECX * 0xb],in_RDI[in_ECX * 0x14]);
  auVar15 = vpaddd_avx2(in_RDI[in_ECX * 0xc],in_RDI[in_ECX * 0x13]);
  auVar32 = vpsubd_avx2(in_RDI[in_ECX * 0xc],in_RDI[in_ECX * 0x13]);
  auVar16 = vpaddd_avx2(in_RDI[in_ECX * 0xd],in_RDI[in_ECX * 0x12]);
  auVar33 = vpsubd_avx2(in_RDI[in_ECX * 0xd],in_RDI[in_ECX * 0x12]);
  auVar17 = vpaddd_avx2(in_RDI[in_ECX * 0xe],in_RDI[in_ECX * 0x11]);
  auVar34 = vpsubd_avx2(in_RDI[in_ECX * 0xe],in_RDI[in_ECX * 0x11]);
  auVar18 = vpaddd_avx2(in_RDI[in_ECX * 0xf],in_RDI[in_ECX * 0x10]);
  auVar35 = vpsubd_avx2(in_RDI[in_ECX * 0xf],in_RDI[in_ECX * 0x10]);
  piVar165 = cospi_arr((int)in_DL);
  auVar19 = vpaddd_avx2(auVar3,auVar18);
  auVar18 = vpsubd_avx2(auVar3,auVar18);
  auVar3 = vpaddd_avx2(auVar4,auVar17);
  auVar36 = vpsubd_avx2(auVar4,auVar17);
  auVar4 = vpaddd_avx2(auVar5,auVar16);
  auVar16 = vpsubd_avx2(auVar5,auVar16);
  auVar5 = vpaddd_avx2(auVar6,auVar15);
  auVar17 = vpsubd_avx2(auVar6,auVar15);
  auVar6 = vpaddd_avx2(auVar7,auVar14);
  auVar37 = vpsubd_avx2(auVar7,auVar14);
  auVar7 = vpaddd_avx2(auVar8,auVar13);
  auVar38 = vpsubd_avx2(auVar8,auVar13);
  auVar8 = vpaddd_avx2(auVar9,auVar12);
  auVar39 = vpsubd_avx2(auVar9,auVar12);
  auVar9 = vpaddd_avx2(auVar10,auVar11);
  auVar40 = vpsubd_avx2(auVar10,auVar11);
  local_6980 = auVar35._0_8_;
  uStack_6968 = auVar35._24_8_;
  local_6960 = auVar34._0_8_;
  uStack_6948 = auVar34._24_8_;
  local_6940 = auVar33._0_8_;
  uStack_6928 = auVar33._24_8_;
  local_6920 = auVar32._0_8_;
  uStack_6908 = auVar32._24_8_;
  uVar164 = -piVar165[0x20];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_10b0 = auVar168._0_8_;
  uStack_10a8 = auVar168._8_8_;
  uVar164 = piVar165[0x20];
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar167 = vpinsrd_avx(auVar167,uVar164,2);
  auVar167 = vpinsrd_avx(auVar167,uVar164,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_1070 = auVar168._0_8_;
  uStack_1068 = auVar168._8_8_;
  auVar163._16_8_ = uStack_10b0;
  auVar163._0_16_ = auVar2;
  auVar163._24_8_ = uStack_10a8;
  auVar10 = vpmulld_avx2(auVar31,auVar163);
  auVar162._16_8_ = uStack_1070;
  auVar162._0_16_ = auVar167;
  auVar162._24_8_ = uStack_1068;
  auVar11 = vpmulld_avx2(auVar24,auVar162);
  auVar10 = vpaddd_avx2(auVar10,auVar11);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar161._16_8_ = uStack_1070;
  auVar161._0_16_ = auVar167;
  auVar161._24_8_ = uStack_1068;
  auVar11 = vpmulld_avx2(auVar31,auVar161);
  auVar160._16_8_ = uStack_10b0;
  auVar160._0_16_ = auVar2;
  auVar160._24_8_ = uStack_10a8;
  auVar12 = vpmulld_avx2(auVar24,auVar160);
  auVar24 = vpsubd_avx2(auVar11,auVar12);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  uVar164 = -piVar165[0x20];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_1030 = auVar168._0_8_;
  uStack_1028 = auVar168._8_8_;
  uVar164 = piVar165[0x20];
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar167 = vpinsrd_avx(auVar167,uVar164,2);
  auVar167 = vpinsrd_avx(auVar167,uVar164,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_ff0 = auVar168._0_8_;
  uStack_fe8 = auVar168._8_8_;
  auVar159._16_8_ = uStack_1030;
  auVar159._0_16_ = auVar2;
  auVar159._24_8_ = uStack_1028;
  auVar11 = vpmulld_avx2(auVar30,auVar159);
  auVar158._16_8_ = uStack_ff0;
  auVar158._0_16_ = auVar167;
  auVar158._24_8_ = uStack_fe8;
  auVar12 = vpmulld_avx2(auVar25,auVar158);
  auVar11 = vpaddd_avx2(auVar11,auVar12);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar157._16_8_ = uStack_ff0;
  auVar157._0_16_ = auVar167;
  auVar157._24_8_ = uStack_fe8;
  auVar12 = vpmulld_avx2(auVar30,auVar157);
  auVar156._16_8_ = uStack_1030;
  auVar156._0_16_ = auVar2;
  auVar156._24_8_ = uStack_1028;
  auVar13 = vpmulld_avx2(auVar25,auVar156);
  auVar25 = vpsubd_avx2(auVar12,auVar13);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  uVar164 = -piVar165[0x20];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_fb0 = auVar168._0_8_;
  uStack_fa8 = auVar168._8_8_;
  uVar164 = piVar165[0x20];
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar167 = vpinsrd_avx(auVar167,uVar164,2);
  auVar167 = vpinsrd_avx(auVar167,uVar164,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_f70 = auVar168._0_8_;
  uStack_f68 = auVar168._8_8_;
  auVar155._16_8_ = uStack_fb0;
  auVar155._0_16_ = auVar2;
  auVar155._24_8_ = uStack_fa8;
  auVar12 = vpmulld_avx2(auVar29,auVar155);
  auVar154._16_8_ = uStack_f70;
  auVar154._0_16_ = auVar167;
  auVar154._24_8_ = uStack_f68;
  auVar13 = vpmulld_avx2(auVar26,auVar154);
  auVar12 = vpaddd_avx2(auVar12,auVar13);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar153._16_8_ = uStack_f70;
  auVar153._0_16_ = auVar167;
  auVar153._24_8_ = uStack_f68;
  auVar13 = vpmulld_avx2(auVar29,auVar153);
  auVar152._16_8_ = uStack_fb0;
  auVar152._0_16_ = auVar2;
  auVar152._24_8_ = uStack_fa8;
  auVar14 = vpmulld_avx2(auVar26,auVar152);
  auVar26 = vpsubd_avx2(auVar13,auVar14);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  uVar164 = -piVar165[0x20];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_f30 = auVar168._0_8_;
  uStack_f28 = auVar168._8_8_;
  uVar164 = piVar165[0x20];
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar167 = vpinsrd_avx(auVar167,uVar164,2);
  auVar167 = vpinsrd_avx(auVar167,uVar164,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_ef0 = auVar168._0_8_;
  uStack_ee8 = auVar168._8_8_;
  auVar151._16_8_ = uStack_f30;
  auVar151._0_16_ = auVar2;
  auVar151._24_8_ = uStack_f28;
  auVar13 = vpmulld_avx2(auVar28,auVar151);
  auVar150._16_8_ = uStack_ef0;
  auVar150._0_16_ = auVar167;
  auVar150._24_8_ = uStack_ee8;
  auVar14 = vpmulld_avx2(auVar27,auVar150);
  auVar13 = vpaddd_avx2(auVar13,auVar14);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar149._16_8_ = uStack_ef0;
  auVar149._0_16_ = auVar167;
  auVar149._24_8_ = uStack_ee8;
  auVar14 = vpmulld_avx2(auVar28,auVar149);
  auVar148._16_8_ = uStack_f30;
  auVar148._0_16_ = auVar2;
  auVar148._24_8_ = uStack_f28;
  auVar15 = vpmulld_avx2(auVar27,auVar148);
  auVar15 = vpsubd_avx2(auVar14,auVar15);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  local_6800 = auVar23._0_8_;
  uStack_67e8 = auVar23._24_8_;
  local_67e0 = auVar22._0_8_;
  uStack_67c8 = auVar22._24_8_;
  local_67c0 = auVar21._0_8_;
  uStack_67a8 = auVar21._24_8_;
  local_67a0 = auVar20._0_8_;
  uStack_6788 = auVar20._24_8_;
  piVar165 = cospi_arr((int)in_DL);
  auVar14 = vpaddd_avx2(auVar19,auVar9);
  auVar19 = vpsubd_avx2(auVar19,auVar9);
  auVar9 = vpaddd_avx2(auVar3,auVar8);
  auVar20 = vpsubd_avx2(auVar3,auVar8);
  auVar3 = vpaddd_avx2(auVar4,auVar7);
  auVar21 = vpsubd_avx2(auVar4,auVar7);
  auVar4 = vpaddd_avx2(auVar5,auVar6);
  auVar22 = vpsubd_avx2(auVar5,auVar6);
  uVar164 = -piVar165[0x20];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_eb0 = auVar168._0_8_;
  uStack_ea8 = auVar168._8_8_;
  uVar164 = piVar165[0x20];
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar167 = vpinsrd_avx(auVar167,uVar164,2);
  auVar167 = vpinsrd_avx(auVar167,uVar164,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_e70 = auVar168._0_8_;
  uStack_e68 = auVar168._8_8_;
  auVar147._16_8_ = uStack_eb0;
  auVar147._0_16_ = auVar2;
  auVar147._24_8_ = uStack_ea8;
  auVar5 = vpmulld_avx2(auVar38,auVar147);
  auVar146._16_8_ = uStack_e70;
  auVar146._0_16_ = auVar167;
  auVar146._24_8_ = uStack_e68;
  auVar6 = vpmulld_avx2(auVar16,auVar146);
  auVar5 = vpaddd_avx2(auVar5,auVar6);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar145._16_8_ = uStack_e70;
  auVar145._0_16_ = auVar167;
  auVar145._24_8_ = uStack_e68;
  auVar6 = vpmulld_avx2(auVar38,auVar145);
  auVar144._16_8_ = uStack_eb0;
  auVar144._0_16_ = auVar2;
  auVar144._24_8_ = uStack_ea8;
  auVar7 = vpmulld_avx2(auVar16,auVar144);
  auVar23 = vpsubd_avx2(auVar6,auVar7);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  uVar164 = -piVar165[0x20];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_e30 = auVar168._0_8_;
  uStack_e28 = auVar168._8_8_;
  uVar164 = piVar165[0x20];
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar167 = vpinsrd_avx(auVar167,uVar164,2);
  auVar167 = vpinsrd_avx(auVar167,uVar164,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_df0 = auVar168._0_8_;
  uStack_de8 = auVar168._8_8_;
  auVar143._16_8_ = uStack_e30;
  auVar143._0_16_ = auVar2;
  auVar143._24_8_ = uStack_e28;
  auVar6 = vpmulld_avx2(auVar37,auVar143);
  auVar142._16_8_ = uStack_df0;
  auVar142._0_16_ = auVar167;
  auVar142._24_8_ = uStack_de8;
  auVar7 = vpmulld_avx2(auVar17,auVar142);
  auVar6 = vpaddd_avx2(auVar6,auVar7);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar141._16_8_ = uStack_df0;
  auVar141._0_16_ = auVar167;
  auVar141._24_8_ = uStack_de8;
  auVar7 = vpmulld_avx2(auVar37,auVar141);
  auVar140._16_8_ = uStack_e30;
  auVar140._0_16_ = auVar2;
  auVar140._24_8_ = uStack_e28;
  auVar8 = vpmulld_avx2(auVar17,auVar140);
  auVar27 = vpsubd_avx2(auVar7,auVar8);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar7._8_8_ = local_6980;
  auVar7._0_8_ = local_6980;
  auVar7._16_8_ = local_6980;
  auVar7._24_8_ = uStack_6968;
  auVar7 = vpaddd_avx2(auVar7,auVar13);
  auVar28._8_8_ = local_6980;
  auVar28._0_8_ = local_6980;
  auVar28._16_8_ = local_6980;
  auVar28._24_8_ = uStack_6968;
  auVar28 = vpsubd_avx2(auVar28,auVar13);
  auVar29._8_8_ = local_6960;
  auVar29._0_8_ = local_6960;
  auVar29._16_8_ = local_6960;
  auVar29._24_8_ = uStack_6948;
  auVar8 = vpaddd_avx2(auVar29,auVar12);
  auVar35._8_8_ = local_6960;
  auVar35._0_8_ = local_6960;
  auVar35._16_8_ = local_6960;
  auVar35._24_8_ = uStack_6948;
  auVar29 = vpsubd_avx2(auVar35,auVar12);
  auVar12._8_8_ = local_6940;
  auVar12._0_8_ = local_6940;
  auVar12._16_8_ = local_6940;
  auVar12._24_8_ = uStack_6928;
  auVar12 = vpaddd_avx2(auVar12,auVar11);
  auVar30._8_8_ = local_6940;
  auVar30._0_8_ = local_6940;
  auVar30._16_8_ = local_6940;
  auVar30._24_8_ = uStack_6928;
  auVar30 = vpsubd_avx2(auVar30,auVar11);
  auVar11._8_8_ = local_6920;
  auVar11._0_8_ = local_6920;
  auVar11._16_8_ = local_6920;
  auVar11._24_8_ = uStack_6908;
  auVar11 = vpaddd_avx2(auVar11,auVar10);
  auVar31._8_8_ = local_6920;
  auVar31._0_8_ = local_6920;
  auVar31._16_8_ = local_6920;
  auVar31._24_8_ = uStack_6908;
  auVar31 = vpsubd_avx2(auVar31,auVar10);
  auVar34._8_8_ = local_67a0;
  auVar34._0_8_ = local_67a0;
  auVar34._16_8_ = local_67a0;
  auVar34._24_8_ = uStack_6788;
  auVar32 = vpsubd_avx2(auVar34,auVar15);
  auVar10._8_8_ = local_67a0;
  auVar10._0_8_ = local_67a0;
  auVar10._16_8_ = local_67a0;
  auVar10._24_8_ = uStack_6788;
  auVar10 = vpaddd_avx2(auVar10,auVar15);
  auVar33._8_8_ = local_67c0;
  auVar33._0_8_ = local_67c0;
  auVar33._16_8_ = local_67c0;
  auVar33._24_8_ = uStack_67a8;
  auVar33 = vpsubd_avx2(auVar33,auVar26);
  auVar13._8_8_ = local_67c0;
  auVar13._0_8_ = local_67c0;
  auVar13._16_8_ = local_67c0;
  auVar13._24_8_ = uStack_67a8;
  auVar13 = vpaddd_avx2(auVar13,auVar26);
  auVar26._8_8_ = local_67e0;
  auVar26._0_8_ = local_67e0;
  auVar26._16_8_ = local_67e0;
  auVar26._24_8_ = uStack_67c8;
  auVar26 = vpsubd_avx2(auVar26,auVar25);
  auVar15._8_8_ = local_67e0;
  auVar15._0_8_ = local_67e0;
  auVar15._16_8_ = local_67e0;
  auVar15._24_8_ = uStack_67c8;
  auVar15 = vpaddd_avx2(auVar15,auVar25);
  auVar25._8_8_ = local_6800;
  auVar25._0_8_ = local_6800;
  auVar25._16_8_ = local_6800;
  auVar25._24_8_ = uStack_67e8;
  auVar25 = vpsubd_avx2(auVar25,auVar24);
  auVar16._8_8_ = local_6800;
  auVar16._0_8_ = local_6800;
  auVar16._16_8_ = local_6800;
  auVar16._24_8_ = uStack_67e8;
  auVar16 = vpaddd_avx2(auVar16,auVar24);
  piVar165 = cospi_arr((int)in_DL);
  auVar17 = vpaddd_avx2(auVar14,auVar4);
  auVar24 = vpsubd_avx2(auVar14,auVar4);
  auVar4 = vpaddd_avx2(auVar9,auVar3);
  auVar34 = vpsubd_avx2(auVar9,auVar3);
  uVar164 = -piVar165[0x20];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_db0 = auVar168._0_8_;
  uStack_da8 = auVar168._8_8_;
  uVar164 = piVar165[0x20];
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar167 = vpinsrd_avx(auVar167,uVar164,2);
  auVar167 = vpinsrd_avx(auVar167,uVar164,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_d70 = auVar168._0_8_;
  uStack_d68 = auVar168._8_8_;
  auVar139._16_8_ = uStack_db0;
  auVar139._0_16_ = auVar2;
  auVar139._24_8_ = uStack_da8;
  auVar3 = vpmulld_avx2(auVar21,auVar139);
  auVar138._16_8_ = uStack_d70;
  auVar138._0_16_ = auVar167;
  auVar138._24_8_ = uStack_d68;
  auVar9 = vpmulld_avx2(auVar20,auVar138);
  auVar3 = vpaddd_avx2(auVar3,auVar9);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar137._16_8_ = uStack_d70;
  auVar137._0_16_ = auVar167;
  auVar137._24_8_ = uStack_d68;
  auVar9 = vpmulld_avx2(auVar21,auVar137);
  auVar136._16_8_ = uStack_db0;
  auVar136._0_16_ = auVar2;
  auVar136._24_8_ = uStack_da8;
  auVar14 = vpmulld_avx2(auVar20,auVar136);
  auVar20 = vpsubd_avx2(auVar9,auVar14);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar9 = vpaddd_avx2(auVar40,auVar6);
  auVar21 = vpsubd_avx2(auVar40,auVar6);
  auVar6 = vpaddd_avx2(auVar39,auVar5);
  auVar35 = vpsubd_avx2(auVar39,auVar5);
  auVar37 = vpsubd_avx2(auVar18,auVar27);
  auVar5 = vpaddd_avx2(auVar18,auVar27);
  auVar18 = vpsubd_avx2(auVar36,auVar23);
  auVar14 = vpaddd_avx2(auVar36,auVar23);
  local_6980 = auVar7._0_8_;
  uStack_6968 = auVar7._24_8_;
  local_6960 = auVar8._0_8_;
  uStack_6948 = auVar8._24_8_;
  uVar164 = -piVar165[0x10];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_d30 = auVar168._0_8_;
  uStack_d28 = auVar168._8_8_;
  uVar164 = piVar165[0x30];
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar167 = vpinsrd_avx(auVar167,uVar164,2);
  auVar167 = vpinsrd_avx(auVar167,uVar164,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_cf0 = auVar168._0_8_;
  uStack_ce8 = auVar168._8_8_;
  auVar135._16_8_ = uStack_d30;
  auVar135._0_16_ = auVar2;
  auVar135._24_8_ = uStack_d28;
  auVar7 = vpmulld_avx2(auVar12,auVar135);
  auVar134._16_8_ = uStack_cf0;
  auVar134._0_16_ = auVar167;
  auVar134._24_8_ = uStack_ce8;
  auVar8 = vpmulld_avx2(auVar15,auVar134);
  auVar7 = vpaddd_avx2(auVar7,auVar8);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar133._16_8_ = uStack_cf0;
  auVar133._0_16_ = auVar167;
  auVar133._24_8_ = uStack_ce8;
  auVar8 = vpmulld_avx2(auVar12,auVar133);
  auVar132._16_8_ = uStack_d30;
  auVar132._0_16_ = auVar2;
  auVar132._24_8_ = uStack_d28;
  auVar12 = vpmulld_avx2(auVar15,auVar132);
  auVar23 = vpsubd_avx2(auVar8,auVar12);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  uVar164 = -piVar165[0x10];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_cb0 = auVar168._0_8_;
  uStack_ca8 = auVar168._8_8_;
  uVar164 = piVar165[0x30];
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar167 = vpinsrd_avx(auVar167,uVar164,2);
  auVar167 = vpinsrd_avx(auVar167,uVar164,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_c70 = auVar168._0_8_;
  uStack_c68 = auVar168._8_8_;
  auVar131._16_8_ = uStack_cb0;
  auVar131._0_16_ = auVar2;
  auVar131._24_8_ = uStack_ca8;
  auVar8 = vpmulld_avx2(auVar11,auVar131);
  auVar130._16_8_ = uStack_c70;
  auVar130._0_16_ = auVar167;
  auVar130._24_8_ = uStack_c68;
  auVar12 = vpmulld_avx2(auVar16,auVar130);
  auVar8 = vpaddd_avx2(auVar8,auVar12);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar129._16_8_ = uStack_c70;
  auVar129._0_16_ = auVar167;
  auVar129._24_8_ = uStack_c68;
  auVar11 = vpmulld_avx2(auVar11,auVar129);
  auVar128._16_8_ = uStack_cb0;
  auVar128._0_16_ = auVar2;
  auVar128._24_8_ = uStack_ca8;
  auVar12 = vpmulld_avx2(auVar16,auVar128);
  auVar27 = vpsubd_avx2(auVar11,auVar12);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  uVar164 = -piVar165[0x30];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_c30 = auVar168._0_8_;
  uStack_c28 = auVar168._8_8_;
  uVar164 = -piVar165[0x10];
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar167 = vpinsrd_avx(auVar167,uVar164,2);
  auVar167 = vpinsrd_avx(auVar167,uVar164,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_bf0 = auVar168._0_8_;
  uStack_be8 = auVar168._8_8_;
  auVar127._16_8_ = uStack_c30;
  auVar127._0_16_ = auVar2;
  auVar127._24_8_ = uStack_c28;
  auVar11 = vpmulld_avx2(auVar31,auVar127);
  auVar126._16_8_ = uStack_bf0;
  auVar126._0_16_ = auVar167;
  auVar126._24_8_ = uStack_be8;
  auVar12 = vpmulld_avx2(auVar25,auVar126);
  auVar11 = vpaddd_avx2(auVar11,auVar12);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar125._16_8_ = uStack_bf0;
  auVar125._0_16_ = auVar167;
  auVar125._24_8_ = uStack_be8;
  auVar12 = vpmulld_avx2(auVar31,auVar125);
  auVar124._16_8_ = uStack_c30;
  auVar124._0_16_ = auVar2;
  auVar124._24_8_ = uStack_c28;
  auVar15 = vpmulld_avx2(auVar25,auVar124);
  auVar25 = vpsubd_avx2(auVar12,auVar15);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  uVar164 = -piVar165[0x30];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_bb0 = auVar168._0_8_;
  uStack_ba8 = auVar168._8_8_;
  uVar164 = -piVar165[0x10];
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar167 = vpinsrd_avx(auVar167,uVar164,2);
  auVar167 = vpinsrd_avx(auVar167,uVar164,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_b70 = auVar168._0_8_;
  uStack_b68 = auVar168._8_8_;
  auVar123._16_8_ = uStack_bb0;
  auVar123._0_16_ = auVar2;
  auVar123._24_8_ = uStack_ba8;
  auVar12 = vpmulld_avx2(auVar30,auVar123);
  auVar122._16_8_ = uStack_b70;
  auVar122._0_16_ = auVar167;
  auVar122._24_8_ = uStack_b68;
  auVar15 = vpmulld_avx2(auVar26,auVar122);
  auVar12 = vpaddd_avx2(auVar12,auVar15);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar121._16_8_ = uStack_b70;
  auVar121._0_16_ = auVar167;
  auVar121._24_8_ = uStack_b68;
  auVar15 = vpmulld_avx2(auVar30,auVar121);
  auVar120._16_8_ = uStack_bb0;
  auVar120._0_16_ = auVar2;
  auVar120._24_8_ = uStack_ba8;
  auVar16 = vpmulld_avx2(auVar26,auVar120);
  auVar26 = vpsubd_avx2(auVar15,auVar16);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  local_67c0 = auVar13._0_8_;
  uStack_67a8 = auVar13._24_8_;
  local_67a0 = auVar10._0_8_;
  uStack_6788 = auVar10._24_8_;
  piVar165 = cospi_arr((int)in_DL);
  uVar164 = piVar165[0x20];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_b30 = auVar168._0_8_;
  uStack_b28 = auVar168._8_8_;
  uVar164 = piVar165[0x20];
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar167 = vpinsrd_avx(auVar167,uVar164,2);
  auVar167 = vpinsrd_avx(auVar167,uVar164,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_af0 = auVar168._0_8_;
  uStack_ae8 = auVar168._8_8_;
  auVar119._16_8_ = uStack_b30;
  auVar119._0_16_ = auVar2;
  auVar119._24_8_ = uStack_b28;
  auVar10 = vpmulld_avx2(auVar17,auVar119);
  auVar118._16_8_ = uStack_af0;
  auVar118._0_16_ = auVar167;
  auVar118._24_8_ = uStack_ae8;
  auVar13 = vpmulld_avx2(auVar4,auVar118);
  auVar10 = vpaddd_avx2(auVar10,auVar13);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar117._16_8_ = uStack_af0;
  auVar117._0_16_ = auVar167;
  auVar117._24_8_ = uStack_ae8;
  auVar13 = vpmulld_avx2(auVar17,auVar117);
  auVar116._16_8_ = uStack_b30;
  auVar116._0_16_ = auVar2;
  auVar116._24_8_ = uStack_b28;
  auVar4 = vpmulld_avx2(auVar4,auVar116);
  auVar30 = vpsubd_avx2(auVar13,auVar4);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  uVar164 = piVar165[0x10];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_ab0 = auVar168._0_8_;
  uStack_aa8 = auVar168._8_8_;
  uVar164 = piVar165[0x30];
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar167 = vpinsrd_avx(auVar167,uVar164,2);
  auVar167 = vpinsrd_avx(auVar167,uVar164,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_a70 = auVar168._0_8_;
  uStack_a68 = auVar168._8_8_;
  auVar4._16_8_ = uStack_ab0;
  auVar4._0_16_ = auVar2;
  auVar4._24_8_ = uStack_aa8;
  auVar4 = vpmulld_avx2(auVar24,auVar4);
  auVar115._16_8_ = uStack_a70;
  auVar115._0_16_ = auVar167;
  auVar115._24_8_ = uStack_a68;
  auVar13 = vpmulld_avx2(auVar34,auVar115);
  auVar4 = vpaddd_avx2(auVar4,auVar13);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar114._16_8_ = uStack_a70;
  auVar114._0_16_ = auVar167;
  auVar114._24_8_ = uStack_a68;
  auVar13 = vpmulld_avx2(auVar24,auVar114);
  auVar24._16_8_ = uStack_ab0;
  auVar24._0_16_ = auVar2;
  auVar24._24_8_ = uStack_aa8;
  auVar15 = vpmulld_avx2(auVar34,auVar24);
  auVar24 = vpsubd_avx2(auVar13,auVar15);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar13 = vpaddd_avx2(auVar22,auVar3);
  auVar22 = vpsubd_avx2(auVar22,auVar3);
  auVar31 = vpsubd_avx2(auVar19,auVar20);
  auVar3 = vpaddd_avx2(auVar19,auVar20);
  uVar164 = -piVar165[0x10];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_a30 = auVar168._0_8_;
  uStack_a28 = auVar168._8_8_;
  uVar164 = piVar165[0x30];
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar167 = vpinsrd_avx(auVar167,uVar164,2);
  auVar167 = vpinsrd_avx(auVar167,uVar164,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_9f0 = auVar168._0_8_;
  uStack_9e8 = auVar168._8_8_;
  auVar113._16_8_ = uStack_a30;
  auVar113._0_16_ = auVar2;
  auVar113._24_8_ = uStack_a28;
  auVar15 = vpmulld_avx2(auVar6,auVar113);
  auVar112._16_8_ = uStack_9f0;
  auVar112._0_16_ = auVar167;
  auVar112._24_8_ = uStack_9e8;
  auVar16 = vpmulld_avx2(auVar14,auVar112);
  auVar15 = vpaddd_avx2(auVar15,auVar16);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar111._16_8_ = uStack_9f0;
  auVar111._0_16_ = auVar167;
  auVar111._24_8_ = uStack_9e8;
  auVar6 = vpmulld_avx2(auVar6,auVar111);
  auVar110._16_8_ = uStack_a30;
  auVar110._0_16_ = auVar2;
  auVar110._24_8_ = uStack_a28;
  auVar14 = vpmulld_avx2(auVar14,auVar110);
  auVar34 = vpsubd_avx2(auVar6,auVar14);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  uVar164 = -piVar165[0x30];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_9b0 = auVar168._0_8_;
  uStack_9a8 = auVar168._8_8_;
  uVar164 = -piVar165[0x10];
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar167 = vpinsrd_avx(auVar167,uVar164,2);
  auVar167 = vpinsrd_avx(auVar167,uVar164,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_970 = auVar168._0_8_;
  uStack_968 = auVar168._8_8_;
  auVar109._16_8_ = uStack_9b0;
  auVar109._0_16_ = auVar2;
  auVar109._24_8_ = uStack_9a8;
  auVar6 = vpmulld_avx2(auVar35,auVar109);
  auVar108._16_8_ = uStack_970;
  auVar108._0_16_ = auVar167;
  auVar108._24_8_ = uStack_968;
  auVar14 = vpmulld_avx2(auVar18,auVar108);
  auVar6 = vpaddd_avx2(auVar6,auVar14);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar107._16_8_ = uStack_970;
  auVar107._0_16_ = auVar167;
  auVar107._24_8_ = uStack_968;
  auVar14 = vpmulld_avx2(auVar35,auVar107);
  auVar106._16_8_ = uStack_9b0;
  auVar106._0_16_ = auVar2;
  auVar106._24_8_ = uStack_9a8;
  auVar16 = vpmulld_avx2(auVar18,auVar106);
  auVar35 = vpsubd_avx2(auVar14,auVar16);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar14._8_8_ = local_6980;
  auVar14._0_8_ = local_6980;
  auVar14._16_8_ = local_6980;
  auVar14._24_8_ = uStack_6968;
  auVar14 = vpaddd_avx2(auVar14,auVar8);
  auVar36._8_8_ = local_6980;
  auVar36._0_8_ = local_6980;
  auVar36._16_8_ = local_6980;
  auVar36._24_8_ = uStack_6968;
  auVar36 = vpsubd_avx2(auVar36,auVar8);
  auVar8._8_8_ = local_6960;
  auVar8._0_8_ = local_6960;
  auVar8._16_8_ = local_6960;
  auVar8._24_8_ = uStack_6948;
  auVar8 = vpaddd_avx2(auVar8,auVar7);
  auVar38._8_8_ = local_6960;
  auVar38._0_8_ = local_6960;
  auVar38._16_8_ = local_6960;
  auVar38._24_8_ = uStack_6948;
  auVar38 = vpsubd_avx2(auVar38,auVar7);
  auVar39 = vpsubd_avx2(auVar28,auVar11);
  auVar7 = vpaddd_avx2(auVar28,auVar11);
  auVar28 = vpsubd_avx2(auVar29,auVar12);
  auVar11 = vpaddd_avx2(auVar29,auVar12);
  auVar12 = vpaddd_avx2(auVar32,auVar25);
  auVar25 = vpsubd_avx2(auVar32,auVar25);
  auVar16 = vpaddd_avx2(auVar33,auVar26);
  auVar26 = vpsubd_avx2(auVar33,auVar26);
  auVar32._8_8_ = local_67a0;
  auVar32._0_8_ = local_67a0;
  auVar32._16_8_ = local_67a0;
  auVar32._24_8_ = uStack_6788;
  auVar29 = vpsubd_avx2(auVar32,auVar27);
  auVar19._8_8_ = local_67a0;
  auVar19._0_8_ = local_67a0;
  auVar19._16_8_ = local_67a0;
  auVar19._24_8_ = uStack_6788;
  auVar17 = vpaddd_avx2(auVar19,auVar27);
  auVar27._8_8_ = local_67c0;
  auVar27._0_8_ = local_67c0;
  auVar27._16_8_ = local_67c0;
  auVar27._24_8_ = uStack_67a8;
  auVar27 = vpsubd_avx2(auVar27,auVar23);
  auVar18._8_8_ = local_67c0;
  auVar18._0_8_ = local_67c0;
  auVar18._16_8_ = local_67c0;
  auVar18._24_8_ = uStack_67a8;
  auVar18 = vpaddd_avx2(auVar18,auVar23);
  piVar165 = cospi_arr((int)in_DL);
  uStack_6b68 = auVar10._24_8_;
  uStack_6b48 = auVar30._24_8_;
  uStack_6b28 = auVar4._24_8_;
  uStack_6b08 = auVar24._24_8_;
  uVar164 = piVar165[8];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_930 = auVar168._0_8_;
  uStack_928 = auVar168._8_8_;
  uVar164 = piVar165[0x38];
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar167 = vpinsrd_avx(auVar167,uVar164,2);
  auVar167 = vpinsrd_avx(auVar167,uVar164,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_8f0 = auVar168._0_8_;
  uStack_8e8 = auVar168._8_8_;
  auVar105._16_8_ = uStack_930;
  auVar105._0_16_ = auVar2;
  auVar105._24_8_ = uStack_928;
  auVar19 = vpmulld_avx2(auVar3,auVar105);
  auVar104._16_8_ = uStack_8f0;
  auVar104._0_16_ = auVar167;
  auVar104._24_8_ = uStack_8e8;
  auVar20 = vpmulld_avx2(auVar13,auVar104);
  auVar19 = vpaddd_avx2(auVar19,auVar20);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar103._16_8_ = uStack_8f0;
  auVar103._0_16_ = auVar167;
  auVar103._24_8_ = uStack_8e8;
  auVar3 = vpmulld_avx2(auVar3,auVar103);
  auVar23._16_8_ = uStack_930;
  auVar23._0_16_ = auVar2;
  auVar23._24_8_ = uStack_928;
  auVar13 = vpmulld_avx2(auVar13,auVar23);
  auVar23 = vpsubd_avx2(auVar3,auVar13);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  uVar164 = piVar165[0x28];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_8b0 = auVar168._0_8_;
  uStack_8a8 = auVar168._8_8_;
  uVar164 = piVar165[0x18];
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar167 = vpinsrd_avx(auVar167,uVar164,2);
  auVar167 = vpinsrd_avx(auVar167,uVar164,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_870 = auVar168._0_8_;
  uStack_868 = auVar168._8_8_;
  auVar3._16_8_ = uStack_8b0;
  auVar3._0_16_ = auVar2;
  auVar3._24_8_ = uStack_8a8;
  auVar3 = vpmulld_avx2(auVar31,auVar3);
  auVar102._16_8_ = uStack_870;
  auVar102._0_16_ = auVar167;
  auVar102._24_8_ = uStack_868;
  auVar13 = vpmulld_avx2(auVar22,auVar102);
  auVar3 = vpaddd_avx2(auVar3,auVar13);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar101._16_8_ = uStack_870;
  auVar101._0_16_ = auVar167;
  auVar101._24_8_ = uStack_868;
  auVar13 = vpmulld_avx2(auVar31,auVar101);
  auVar100._16_8_ = uStack_8b0;
  auVar100._0_16_ = auVar2;
  auVar100._24_8_ = uStack_8a8;
  auVar20 = vpmulld_avx2(auVar22,auVar100);
  auVar22 = vpsubd_avx2(auVar13,auVar20);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar13 = vpaddd_avx2(auVar9,auVar15);
  auVar31 = vpsubd_avx2(auVar9,auVar15);
  auVar32 = vpsubd_avx2(auVar21,auVar6);
  auVar6 = vpaddd_avx2(auVar21,auVar6);
  auVar9 = vpaddd_avx2(auVar37,auVar35);
  auVar21 = vpsubd_avx2(auVar37,auVar35);
  auVar33 = vpsubd_avx2(auVar5,auVar34);
  auVar5 = vpaddd_avx2(auVar5,auVar34);
  local_6980 = auVar14._0_8_;
  uStack_6968 = auVar14._24_8_;
  uVar164 = -piVar165[8];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_830 = auVar168._0_8_;
  uStack_828 = auVar168._8_8_;
  uVar164 = piVar165[0x38];
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar167 = vpinsrd_avx(auVar167,uVar164,2);
  auVar167 = vpinsrd_avx(auVar167,uVar164,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_7f0 = auVar168._0_8_;
  uStack_7e8 = auVar168._8_8_;
  auVar99._16_8_ = uStack_830;
  auVar99._0_16_ = auVar2;
  auVar99._24_8_ = uStack_828;
  auVar14 = vpmulld_avx2(auVar8,auVar99);
  auVar98._16_8_ = uStack_7f0;
  auVar98._0_16_ = auVar167;
  auVar98._24_8_ = uStack_7e8;
  auVar15 = vpmulld_avx2(auVar18,auVar98);
  auVar14 = vpaddd_avx2(auVar14,auVar15);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar97._16_8_ = uStack_7f0;
  auVar97._0_16_ = auVar167;
  auVar97._24_8_ = uStack_7e8;
  auVar8 = vpmulld_avx2(auVar8,auVar97);
  auVar96._16_8_ = uStack_830;
  auVar96._0_16_ = auVar2;
  auVar96._24_8_ = uStack_828;
  auVar15 = vpmulld_avx2(auVar18,auVar96);
  auVar34 = vpsubd_avx2(auVar8,auVar15);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  uVar164 = -piVar165[0x38];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_7b0 = auVar168._0_8_;
  uStack_7a8 = auVar168._8_8_;
  uVar164 = -piVar165[8];
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar167 = vpinsrd_avx(auVar167,uVar164,2);
  auVar167 = vpinsrd_avx(auVar167,uVar164,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_770 = auVar168._0_8_;
  uStack_768 = auVar168._8_8_;
  auVar95._16_8_ = uStack_7b0;
  auVar95._0_16_ = auVar2;
  auVar95._24_8_ = uStack_7a8;
  auVar8 = vpmulld_avx2(auVar38,auVar95);
  auVar94._16_8_ = uStack_770;
  auVar94._0_16_ = auVar167;
  auVar94._24_8_ = uStack_768;
  auVar15 = vpmulld_avx2(auVar27,auVar94);
  auVar8 = vpaddd_avx2(auVar8,auVar15);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar93._16_8_ = uStack_770;
  auVar93._0_16_ = auVar167;
  auVar93._24_8_ = uStack_768;
  auVar15 = vpmulld_avx2(auVar38,auVar93);
  auVar92._16_8_ = uStack_7b0;
  auVar92._0_16_ = auVar2;
  auVar92._24_8_ = uStack_7a8;
  auVar18 = vpmulld_avx2(auVar27,auVar92);
  auVar27 = vpsubd_avx2(auVar15,auVar18);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  uVar164 = -piVar165[0x28];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_730 = auVar168._0_8_;
  uStack_728 = auVar168._8_8_;
  uVar164 = piVar165[0x18];
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar167 = vpinsrd_avx(auVar167,uVar164,2);
  auVar167 = vpinsrd_avx(auVar167,uVar164,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_6f0 = auVar168._0_8_;
  uStack_6e8 = auVar168._8_8_;
  auVar91._16_8_ = uStack_730;
  auVar91._0_16_ = auVar2;
  auVar91._24_8_ = uStack_728;
  auVar15 = vpmulld_avx2(auVar28,auVar91);
  auVar90._16_8_ = uStack_6f0;
  auVar90._0_16_ = auVar167;
  auVar90._24_8_ = uStack_6e8;
  auVar18 = vpmulld_avx2(auVar26,auVar90);
  auVar15 = vpaddd_avx2(auVar15,auVar18);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar89._16_8_ = uStack_6f0;
  auVar89._0_16_ = auVar167;
  auVar89._24_8_ = uStack_6e8;
  auVar18 = vpmulld_avx2(auVar28,auVar89);
  auVar88._16_8_ = uStack_730;
  auVar88._0_16_ = auVar2;
  auVar88._24_8_ = uStack_728;
  auVar20 = vpmulld_avx2(auVar26,auVar88);
  auVar26 = vpsubd_avx2(auVar18,auVar20);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  uVar164 = -piVar165[0x18];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_6b0 = auVar168._0_8_;
  uStack_6a8 = auVar168._8_8_;
  uVar164 = -piVar165[0x28];
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar167 = vpinsrd_avx(auVar167,uVar164,2);
  auVar167 = vpinsrd_avx(auVar167,uVar164,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_670 = auVar168._0_8_;
  uStack_668 = auVar168._8_8_;
  auVar87._16_8_ = uStack_6b0;
  auVar87._0_16_ = auVar2;
  auVar87._24_8_ = uStack_6a8;
  auVar18 = vpmulld_avx2(auVar11,auVar87);
  auVar86._16_8_ = uStack_670;
  auVar86._0_16_ = auVar167;
  auVar86._24_8_ = uStack_668;
  auVar20 = vpmulld_avx2(auVar16,auVar86);
  auVar18 = vpaddd_avx2(auVar18,auVar20);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar85._16_8_ = uStack_670;
  auVar85._0_16_ = auVar167;
  auVar85._24_8_ = uStack_668;
  auVar11 = vpmulld_avx2(auVar11,auVar85);
  auVar84._16_8_ = uStack_6b0;
  auVar84._0_16_ = auVar2;
  auVar84._24_8_ = uStack_6a8;
  auVar16 = vpmulld_avx2(auVar16,auVar84);
  auVar20 = vpsubd_avx2(auVar11,auVar16);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  local_67a0 = auVar17._0_8_;
  uStack_6788 = auVar17._24_8_;
  piVar165 = cospi_arr((int)in_DL);
  uStack_6770 = auVar10._16_8_;
  uStack_6750 = auVar30._16_8_;
  uStack_6730 = auVar4._16_8_;
  uStack_6710 = auVar24._16_8_;
  uStack_66e8 = auVar19._24_8_;
  uStack_66c8 = auVar3._24_8_;
  uStack_66a8 = auVar22._24_8_;
  uStack_6688 = auVar23._24_8_;
  uVar164 = piVar165[4];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_630 = auVar168._0_8_;
  uStack_628 = auVar168._8_8_;
  uVar164 = piVar165[0x3c];
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar167 = vpinsrd_avx(auVar167,uVar164,2);
  auVar167 = vpinsrd_avx(auVar167,uVar164,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_5f0 = auVar168._0_8_;
  uStack_5e8 = auVar168._8_8_;
  auVar83._16_8_ = uStack_630;
  auVar83._0_16_ = auVar2;
  auVar83._24_8_ = uStack_628;
  auVar11 = vpmulld_avx2(auVar5,auVar83);
  auVar82._16_8_ = uStack_5f0;
  auVar82._0_16_ = auVar167;
  auVar82._24_8_ = uStack_5e8;
  auVar16 = vpmulld_avx2(auVar13,auVar82);
  auVar11 = vpaddd_avx2(auVar11,auVar16);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar81._16_8_ = uStack_5f0;
  auVar81._0_16_ = auVar167;
  auVar81._24_8_ = uStack_5e8;
  auVar5 = vpmulld_avx2(auVar5,auVar81);
  auVar80._16_8_ = uStack_630;
  auVar80._0_16_ = auVar2;
  auVar80._24_8_ = uStack_628;
  auVar13 = vpmulld_avx2(auVar13,auVar80);
  auVar28 = vpsubd_avx2(auVar5,auVar13);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  uVar164 = piVar165[0x24];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_5b0 = auVar168._0_8_;
  uStack_5a8 = auVar168._8_8_;
  uVar164 = piVar165[0x1c];
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar167 = vpinsrd_avx(auVar167,uVar164,2);
  auVar167 = vpinsrd_avx(auVar167,uVar164,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_570 = auVar168._0_8_;
  uStack_568 = auVar168._8_8_;
  auVar5._16_8_ = uStack_5b0;
  auVar5._0_16_ = auVar2;
  auVar5._24_8_ = uStack_5a8;
  auVar5 = vpmulld_avx2(auVar33,auVar5);
  auVar79._16_8_ = uStack_570;
  auVar79._0_16_ = auVar167;
  auVar79._24_8_ = uStack_568;
  auVar13 = vpmulld_avx2(auVar31,auVar79);
  auVar5 = vpaddd_avx2(auVar5,auVar13);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar78._16_8_ = uStack_570;
  auVar78._0_16_ = auVar167;
  auVar78._24_8_ = uStack_568;
  auVar13 = vpmulld_avx2(auVar33,auVar78);
  auVar77._16_8_ = uStack_5b0;
  auVar77._0_16_ = auVar2;
  auVar77._24_8_ = uStack_5a8;
  auVar16 = vpmulld_avx2(auVar31,auVar77);
  auVar31 = vpsubd_avx2(auVar13,auVar16);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  uVar164 = piVar165[0x14];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_530 = auVar168._0_8_;
  uStack_528 = auVar168._8_8_;
  uVar164 = piVar165[0x2c];
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar167 = vpinsrd_avx(auVar167,uVar164,2);
  auVar167 = vpinsrd_avx(auVar167,uVar164,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_4f0 = auVar168._0_8_;
  uStack_4e8 = auVar168._8_8_;
  auVar76._16_8_ = uStack_530;
  auVar76._0_16_ = auVar2;
  auVar76._24_8_ = uStack_528;
  auVar13 = vpmulld_avx2(auVar21,auVar76);
  auVar75._16_8_ = uStack_4f0;
  auVar75._0_16_ = auVar167;
  auVar75._24_8_ = uStack_4e8;
  auVar16 = vpmulld_avx2(auVar32,auVar75);
  auVar13 = vpaddd_avx2(auVar13,auVar16);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar74._16_8_ = uStack_4f0;
  auVar74._0_16_ = auVar167;
  auVar74._24_8_ = uStack_4e8;
  auVar16 = vpmulld_avx2(auVar21,auVar74);
  auVar73._16_8_ = uStack_530;
  auVar73._0_16_ = auVar2;
  auVar73._24_8_ = uStack_528;
  auVar17 = vpmulld_avx2(auVar32,auVar73);
  auVar32 = vpsubd_avx2(auVar16,auVar17);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  uVar164 = piVar165[0x34];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_4b0 = auVar168._0_8_;
  uStack_4a8 = auVar168._8_8_;
  uVar164 = piVar165[0xc];
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar167 = vpinsrd_avx(auVar167,uVar164,2);
  auVar167 = vpinsrd_avx(auVar167,uVar164,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_470 = auVar168._0_8_;
  uStack_468 = auVar168._8_8_;
  auVar72._16_8_ = uStack_4b0;
  auVar72._0_16_ = auVar2;
  auVar72._24_8_ = uStack_4a8;
  auVar16 = vpmulld_avx2(auVar9,auVar72);
  auVar71._16_8_ = uStack_470;
  auVar71._0_16_ = auVar167;
  auVar71._24_8_ = uStack_468;
  auVar17 = vpmulld_avx2(auVar6,auVar71);
  auVar16 = vpaddd_avx2(auVar16,auVar17);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar70._16_8_ = uStack_470;
  auVar70._0_16_ = auVar167;
  auVar70._24_8_ = uStack_468;
  auVar9 = vpmulld_avx2(auVar9,auVar70);
  auVar69._16_8_ = uStack_4b0;
  auVar69._0_16_ = auVar2;
  auVar69._24_8_ = uStack_4a8;
  auVar6 = vpmulld_avx2(auVar6,auVar69);
  auVar33 = vpsubd_avx2(auVar9,auVar6);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar6._8_8_ = local_6980;
  auVar6._0_8_ = local_6980;
  auVar6._16_8_ = local_6980;
  auVar6._24_8_ = uStack_6968;
  auVar6 = vpaddd_avx2(auVar6,auVar14);
  auVar9._8_8_ = local_6980;
  auVar9._0_8_ = local_6980;
  auVar9._16_8_ = local_6980;
  auVar9._24_8_ = uStack_6968;
  auVar21 = vpsubd_avx2(auVar9,auVar14);
  auVar35 = vpsubd_avx2(auVar36,auVar8);
  auVar8 = vpaddd_avx2(auVar36,auVar8);
  auVar9 = vpaddd_avx2(auVar39,auVar15);
  auVar36 = vpsubd_avx2(auVar39,auVar15);
  auVar37 = vpsubd_avx2(auVar7,auVar18);
  auVar7 = vpaddd_avx2(auVar7,auVar18);
  auVar14 = vpaddd_avx2(auVar12,auVar20);
  auVar38 = vpsubd_avx2(auVar12,auVar20);
  auVar39 = vpsubd_avx2(auVar25,auVar26);
  auVar12 = vpaddd_avx2(auVar25,auVar26);
  auVar15 = vpaddd_avx2(auVar29,auVar27);
  auVar25 = vpsubd_avx2(auVar29,auVar27);
  auVar20._8_8_ = local_67a0;
  auVar20._0_8_ = local_67a0;
  auVar20._16_8_ = local_67a0;
  auVar20._24_8_ = uStack_6788;
  auVar26 = vpsubd_avx2(auVar20,auVar34);
  auVar17._8_8_ = local_67a0;
  auVar17._0_8_ = local_67a0;
  auVar17._16_8_ = local_67a0;
  auVar17._24_8_ = uStack_6788;
  auVar17 = vpaddd_avx2(auVar17,auVar34);
  piVar165 = cospi_arr((int)in_DL);
  uStack_6af0 = auVar19._16_8_;
  uStack_6ad0 = auVar3._16_8_;
  uStack_6ab0 = auVar22._16_8_;
  uStack_6a90 = auVar23._16_8_;
  uStack_6a68 = auVar11._24_8_;
  uStack_6a48 = auVar5._24_8_;
  uStack_6a28 = auVar13._24_8_;
  uStack_6a08 = auVar16._24_8_;
  uStack_69e8 = auVar33._24_8_;
  uStack_69c8 = auVar32._24_8_;
  uStack_69a8 = auVar31._24_8_;
  uStack_6988 = auVar28._24_8_;
  uVar164 = piVar165[2];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_430 = auVar168._0_8_;
  uStack_428 = auVar168._8_8_;
  uVar164 = piVar165[0x3e];
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar167 = vpinsrd_avx(auVar167,uVar164,2);
  auVar167 = vpinsrd_avx(auVar167,uVar164,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_3f0 = auVar168._0_8_;
  uStack_3e8 = auVar168._8_8_;
  auVar68._16_8_ = uStack_430;
  auVar68._0_16_ = auVar2;
  auVar68._24_8_ = uStack_428;
  auVar18 = vpmulld_avx2(auVar17,auVar68);
  auVar67._16_8_ = uStack_3f0;
  auVar67._0_16_ = auVar167;
  auVar67._24_8_ = uStack_3e8;
  auVar20 = vpmulld_avx2(auVar6,auVar67);
  auVar18 = vpaddd_avx2(auVar18,auVar20);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar66._16_8_ = uStack_3f0;
  auVar66._0_16_ = auVar167;
  auVar66._24_8_ = uStack_3e8;
  auVar17 = vpmulld_avx2(auVar17,auVar66);
  auVar65._16_8_ = uStack_430;
  auVar65._0_16_ = auVar2;
  auVar65._24_8_ = uStack_428;
  auVar6 = vpmulld_avx2(auVar6,auVar65);
  auVar27 = vpsubd_avx2(auVar17,auVar6);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(in_stack_ffffffffffff7acc,in_stack_ffffffffffff7ac8),
             in_stack_ffffffffffff7ac4,in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  uVar164 = piVar165[0x22];
  auVar2 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar2 = vpinsrd_avx(auVar2,uVar164,2);
  auVar2 = vpinsrd_avx(auVar2,uVar164,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar164),uVar164,1);
  auVar168 = vpinsrd_avx(auVar168,uVar164,2);
  auVar168 = vpinsrd_avx(auVar168,uVar164,3);
  uStack_3b0 = auVar168._0_8_;
  uStack_3a8 = auVar168._8_8_;
  uVar170 = piVar165[0x1e];
  auVar168 = vpinsrd_avx(ZEXT416(uVar170),uVar170,1);
  auVar168 = vpinsrd_avx(auVar168,uVar170,2);
  auVar168 = vpinsrd_avx(auVar168,uVar170,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar170),uVar170,1);
  auVar167 = vpinsrd_avx(auVar167,uVar170,2);
  auVar167 = vpinsrd_avx(auVar167,uVar170,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_370 = auVar168._0_8_;
  uStack_368 = auVar168._8_8_;
  auVar64._16_8_ = uStack_3b0;
  auVar64._0_16_ = auVar2;
  auVar64._24_8_ = uStack_3a8;
  auVar6 = vpmulld_avx2(auVar26,auVar64);
  auVar63._16_8_ = uStack_370;
  auVar63._0_16_ = auVar167;
  auVar63._24_8_ = uStack_368;
  auVar17 = vpmulld_avx2(auVar21,auVar63);
  auVar6 = vpaddd_avx2(auVar6,auVar17);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(uVar170,uVar164),in_stack_ffffffffffff7ac4,
             in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  auVar62._16_8_ = uStack_370;
  auVar62._0_16_ = auVar167;
  auVar62._24_8_ = uStack_368;
  auVar17 = vpmulld_avx2(auVar26,auVar62);
  auVar61._16_8_ = uStack_3b0;
  auVar61._0_16_ = auVar2;
  auVar61._24_8_ = uStack_3a8;
  auVar20 = vpmulld_avx2(auVar21,auVar61);
  auVar26 = vpsubd_avx2(auVar17,auVar20);
  round_shift_32_8xn_avx2
            ((__m256i *)CONCAT44(uVar170,uVar164),in_stack_ffffffffffff7ac4,
             in_stack_ffffffffffff7ac0,in_stack_ffffffffffff7abc);
  bit = piVar165[0x12];
  auVar2 = vpinsrd_avx(ZEXT416(bit),bit,1);
  auVar2 = vpinsrd_avx(auVar2,bit,2);
  auVar2 = vpinsrd_avx(auVar2,bit,3);
  auVar168 = vpinsrd_avx(ZEXT416(bit),bit,1);
  auVar168 = vpinsrd_avx(auVar168,bit,2);
  auVar168 = vpinsrd_avx(auVar168,bit,3);
  uStack_330 = auVar168._0_8_;
  uStack_328 = auVar168._8_8_;
  size = piVar165[0x2e];
  auVar168 = vpinsrd_avx(ZEXT416(size),size,1);
  auVar168 = vpinsrd_avx(auVar168,size,2);
  auVar168 = vpinsrd_avx(auVar168,size,3);
  auVar167 = vpinsrd_avx(ZEXT416(size),size,1);
  auVar167 = vpinsrd_avx(auVar167,size,2);
  auVar167 = vpinsrd_avx(auVar167,size,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_2f0 = auVar168._0_8_;
  uStack_2e8 = auVar168._8_8_;
  auVar60._16_8_ = uStack_330;
  auVar60._0_16_ = auVar2;
  auVar60._24_8_ = uStack_328;
  auVar17 = vpmulld_avx2(auVar25,auVar60);
  auVar59._16_8_ = uStack_2f0;
  auVar59._0_16_ = auVar167;
  auVar59._24_8_ = uStack_2e8;
  auVar20 = vpmulld_avx2(auVar35,auVar59);
  auVar17 = vpaddd_avx2(auVar17,auVar20);
  round_shift_32_8xn_avx2((__m256i *)CONCAT44(uVar170,uVar164),size,bit,in_stack_ffffffffffff7abc);
  auVar58._16_8_ = uStack_2f0;
  auVar58._0_16_ = auVar167;
  auVar58._24_8_ = uStack_2e8;
  auVar20 = vpmulld_avx2(auVar25,auVar58);
  auVar57._16_8_ = uStack_330;
  auVar57._0_16_ = auVar2;
  auVar57._24_8_ = uStack_328;
  auVar21 = vpmulld_avx2(auVar35,auVar57);
  auVar25 = vpsubd_avx2(auVar20,auVar21);
  round_shift_32_8xn_avx2((__m256i *)CONCAT44(uVar170,uVar164),size,bit,in_stack_ffffffffffff7abc);
  uVar169 = piVar165[0x32];
  auVar2 = vpinsrd_avx(ZEXT416(uVar169),uVar169,1);
  auVar2 = vpinsrd_avx(auVar2,uVar169,2);
  auVar2 = vpinsrd_avx(auVar2,uVar169,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar169),uVar169,1);
  auVar168 = vpinsrd_avx(auVar168,uVar169,2);
  auVar168 = vpinsrd_avx(auVar168,uVar169,3);
  uStack_2b0 = auVar168._0_8_;
  uStack_2a8 = auVar168._8_8_;
  uVar169 = piVar165[0xe];
  auVar168 = vpinsrd_avx(ZEXT416(uVar169),uVar169,1);
  auVar168 = vpinsrd_avx(auVar168,uVar169,2);
  auVar168 = vpinsrd_avx(auVar168,uVar169,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar169),uVar169,1);
  auVar167 = vpinsrd_avx(auVar167,uVar169,2);
  auVar167 = vpinsrd_avx(auVar167,uVar169,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_270 = auVar168._0_8_;
  uStack_268 = auVar168._8_8_;
  auVar56._16_8_ = uStack_2b0;
  auVar56._0_16_ = auVar2;
  auVar56._24_8_ = uStack_2a8;
  auVar20 = vpmulld_avx2(auVar15,auVar56);
  auVar55._16_8_ = uStack_270;
  auVar55._0_16_ = auVar167;
  auVar55._24_8_ = uStack_268;
  auVar21 = vpmulld_avx2(auVar8,auVar55);
  auVar20 = vpaddd_avx2(auVar20,auVar21);
  round_shift_32_8xn_avx2((__m256i *)CONCAT44(uVar170,uVar164),size,bit,uVar169);
  auVar54._16_8_ = uStack_270;
  auVar54._0_16_ = auVar167;
  auVar54._24_8_ = uStack_268;
  auVar15 = vpmulld_avx2(auVar15,auVar54);
  auVar53._16_8_ = uStack_2b0;
  auVar53._0_16_ = auVar2;
  auVar53._24_8_ = uStack_2a8;
  auVar8 = vpmulld_avx2(auVar8,auVar53);
  auVar29 = vpsubd_avx2(auVar15,auVar8);
  round_shift_32_8xn_avx2((__m256i *)CONCAT44(uVar170,uVar164),size,bit,uVar169);
  uVar1 = piVar165[10];
  auVar2 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar2 = vpinsrd_avx(auVar2,uVar1,2);
  auVar2 = vpinsrd_avx(auVar2,uVar1,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar168 = vpinsrd_avx(auVar168,uVar1,2);
  auVar168 = vpinsrd_avx(auVar168,uVar1,3);
  uStack_230 = auVar168._0_8_;
  uStack_228 = auVar168._8_8_;
  uVar1 = piVar165[0x36];
  auVar168 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar168 = vpinsrd_avx(auVar168,uVar1,2);
  auVar168 = vpinsrd_avx(auVar168,uVar1,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar167 = vpinsrd_avx(auVar167,uVar1,2);
  auVar167 = vpinsrd_avx(auVar167,uVar1,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_1f0 = auVar168._0_8_;
  uStack_1e8 = auVar168._8_8_;
  auVar52._16_8_ = uStack_230;
  auVar52._0_16_ = auVar2;
  auVar52._24_8_ = uStack_228;
  auVar8 = vpmulld_avx2(auVar12,auVar52);
  auVar51._16_8_ = uStack_1f0;
  auVar51._0_16_ = auVar167;
  auVar51._24_8_ = uStack_1e8;
  auVar15 = vpmulld_avx2(auVar9,auVar51);
  auVar8 = vpaddd_avx2(auVar8,auVar15);
  round_shift_32_8xn_avx2((__m256i *)CONCAT44(uVar170,uVar164),size,bit,uVar169);
  auVar50._16_8_ = uStack_1f0;
  auVar50._0_16_ = auVar167;
  auVar50._24_8_ = uStack_1e8;
  auVar12 = vpmulld_avx2(auVar12,auVar50);
  auVar49._16_8_ = uStack_230;
  auVar49._0_16_ = auVar2;
  auVar49._24_8_ = uStack_228;
  auVar9 = vpmulld_avx2(auVar9,auVar49);
  auVar34 = vpsubd_avx2(auVar12,auVar9);
  round_shift_32_8xn_avx2((__m256i *)CONCAT44(uVar170,uVar164),size,bit,uVar169);
  uVar1 = piVar165[0x2a];
  auVar2 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar2 = vpinsrd_avx(auVar2,uVar1,2);
  auVar2 = vpinsrd_avx(auVar2,uVar1,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar168 = vpinsrd_avx(auVar168,uVar1,2);
  auVar168 = vpinsrd_avx(auVar168,uVar1,3);
  uStack_1b0 = auVar168._0_8_;
  uStack_1a8 = auVar168._8_8_;
  uVar1 = piVar165[0x16];
  auVar168 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar168 = vpinsrd_avx(auVar168,uVar1,2);
  auVar168 = vpinsrd_avx(auVar168,uVar1,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar167 = vpinsrd_avx(auVar167,uVar1,2);
  auVar167 = vpinsrd_avx(auVar167,uVar1,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_170 = auVar168._0_8_;
  uStack_168 = auVar168._8_8_;
  auVar48._16_8_ = uStack_1b0;
  auVar48._0_16_ = auVar2;
  auVar48._24_8_ = uStack_1a8;
  auVar9 = vpmulld_avx2(auVar39,auVar48);
  auVar47._16_8_ = uStack_170;
  auVar47._0_16_ = auVar167;
  auVar47._24_8_ = uStack_168;
  auVar12 = vpmulld_avx2(auVar36,auVar47);
  auVar9 = vpaddd_avx2(auVar9,auVar12);
  round_shift_32_8xn_avx2((__m256i *)CONCAT44(uVar170,uVar164),size,bit,uVar169);
  auVar46._16_8_ = uStack_170;
  auVar46._0_16_ = auVar167;
  auVar46._24_8_ = uStack_168;
  auVar12 = vpmulld_avx2(auVar39,auVar46);
  auVar45._16_8_ = uStack_1b0;
  auVar45._0_16_ = auVar2;
  auVar45._24_8_ = uStack_1a8;
  auVar15 = vpmulld_avx2(auVar36,auVar45);
  auVar35 = vpsubd_avx2(auVar12,auVar15);
  round_shift_32_8xn_avx2((__m256i *)CONCAT44(uVar170,uVar164),size,bit,uVar169);
  uVar1 = piVar165[0x1a];
  auVar2 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar2 = vpinsrd_avx(auVar2,uVar1,2);
  auVar2 = vpinsrd_avx(auVar2,uVar1,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar168 = vpinsrd_avx(auVar168,uVar1,2);
  auVar168 = vpinsrd_avx(auVar168,uVar1,3);
  uStack_130 = auVar168._0_8_;
  uStack_128 = auVar168._8_8_;
  uVar1 = piVar165[0x26];
  auVar168 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar168 = vpinsrd_avx(auVar168,uVar1,2);
  auVar168 = vpinsrd_avx(auVar168,uVar1,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar167 = vpinsrd_avx(auVar167,uVar1,2);
  auVar167 = vpinsrd_avx(auVar167,uVar1,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_f0 = auVar168._0_8_;
  uStack_e8 = auVar168._8_8_;
  auVar44._16_8_ = uStack_130;
  auVar44._0_16_ = auVar2;
  auVar44._24_8_ = uStack_128;
  auVar12 = vpmulld_avx2(auVar38,auVar44);
  auVar43._16_8_ = uStack_f0;
  auVar43._0_16_ = auVar167;
  auVar43._24_8_ = uStack_e8;
  auVar15 = vpmulld_avx2(auVar37,auVar43);
  auVar12 = vpaddd_avx2(auVar12,auVar15);
  round_shift_32_8xn_avx2((__m256i *)CONCAT44(uVar170,uVar164),size,bit,uVar169);
  auVar42._16_8_ = uStack_f0;
  auVar42._0_16_ = auVar167;
  auVar42._24_8_ = uStack_e8;
  auVar15 = vpmulld_avx2(auVar38,auVar42);
  auVar41._16_8_ = uStack_130;
  auVar41._0_16_ = auVar2;
  auVar41._24_8_ = uStack_128;
  auVar21 = vpmulld_avx2(auVar37,auVar41);
  auVar36 = vpsubd_avx2(auVar15,auVar21);
  round_shift_32_8xn_avx2((__m256i *)CONCAT44(uVar170,uVar164),size,bit,uVar169);
  uVar1 = piVar165[0x3a];
  auVar2 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar2 = vpinsrd_avx(auVar2,uVar1,2);
  auVar2 = vpinsrd_avx(auVar2,uVar1,3);
  auVar168 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar168 = vpinsrd_avx(auVar168,uVar1,2);
  auVar168 = vpinsrd_avx(auVar168,uVar1,3);
  uStack_b0 = auVar168._0_8_;
  uStack_a8 = auVar168._8_8_;
  uVar1 = piVar165[6];
  auVar168 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar168 = vpinsrd_avx(auVar168,uVar1,2);
  auVar168 = vpinsrd_avx(auVar168,uVar1,3);
  auVar167 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar167 = vpinsrd_avx(auVar167,uVar1,2);
  auVar167 = vpinsrd_avx(auVar167,uVar1,3);
  auVar167 = ZEXT116(0) * auVar168 + ZEXT116(1) * auVar167;
  auVar168 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar168;
  uStack_70 = auVar168._0_8_;
  uStack_68 = auVar168._8_8_;
  auVar40._16_8_ = uStack_b0;
  auVar40._0_16_ = auVar2;
  auVar40._24_8_ = uStack_a8;
  auVar15 = vpmulld_avx2(auVar14,auVar40);
  auVar39._16_8_ = uStack_70;
  auVar39._0_16_ = auVar167;
  auVar39._24_8_ = uStack_68;
  auVar21 = vpmulld_avx2(auVar7,auVar39);
  auVar15 = vpaddd_avx2(auVar15,auVar21);
  round_shift_32_8xn_avx2((__m256i *)CONCAT44(uVar170,uVar164),size,bit,uVar169);
  auVar37._16_8_ = uStack_70;
  auVar37._0_16_ = auVar167;
  auVar37._24_8_ = uStack_68;
  auVar14 = vpmulld_avx2(auVar14,auVar37);
  auVar21._16_8_ = uStack_b0;
  auVar21._0_16_ = auVar2;
  auVar21._24_8_ = uStack_a8;
  auVar7 = vpmulld_avx2(auVar7,auVar21);
  auVar7 = vpsubd_avx2(auVar14,auVar7);
  round_shift_32_8xn_avx2((__m256i *)CONCAT44(uVar170,uVar164),size,bit,uVar169);
  local_6780 = auVar10._0_8_;
  uStack_6778 = auVar10._8_8_;
  *in_RSI = local_6780;
  in_RSI[1] = uStack_6778;
  in_RSI[2] = uStack_6770;
  in_RSI[3] = uStack_6b68;
  local_63a0 = auVar27._0_8_;
  uStack_6398 = auVar27._8_8_;
  uStack_6390 = auVar27._16_8_;
  uStack_6388 = auVar27._24_8_;
  puVar166 = in_RSI + (long)(in_R8D * 0x1f) * 4;
  *puVar166 = local_63a0;
  puVar166[1] = uStack_6398;
  puVar166[2] = uStack_6390;
  puVar166[3] = uStack_6388;
  local_6580 = auVar18._0_8_;
  uStack_6578 = auVar18._8_8_;
  uStack_6570 = auVar18._16_8_;
  uStack_6568 = auVar18._24_8_;
  puVar166 = in_RSI + (long)in_R8D * 4;
  *puVar166 = local_6580;
  puVar166[1] = uStack_6578;
  puVar166[2] = uStack_6570;
  puVar166[3] = uStack_6568;
  local_65a0 = auVar28._0_8_;
  uStack_6598 = auVar28._8_8_;
  uStack_6590 = auVar28._16_8_;
  puVar166 = in_RSI + (long)(in_R8D * 0x1e) * 4;
  *puVar166 = local_65a0;
  puVar166[1] = uStack_6598;
  puVar166[2] = uStack_6590;
  puVar166[3] = uStack_6988;
  local_6680 = auVar11._0_8_;
  uStack_6678 = auVar11._8_8_;
  uStack_6670 = auVar11._16_8_;
  puVar166 = in_RSI + (long)(in_R8D * 2) * 4;
  *puVar166 = local_6680;
  puVar166[1] = uStack_6678;
  puVar166[2] = uStack_6670;
  puVar166[3] = uStack_6a68;
  local_64a0 = auVar15._0_8_;
  uStack_6498 = auVar15._8_8_;
  uStack_6490 = auVar15._16_8_;
  uStack_6488 = auVar15._24_8_;
  puVar166 = in_RSI + (long)(in_R8D * 0x1d) * 4;
  *puVar166 = local_64a0;
  puVar166[1] = uStack_6498;
  puVar166[2] = uStack_6490;
  puVar166[3] = uStack_6488;
  local_6480 = auVar7._0_8_;
  uStack_6478 = auVar7._8_8_;
  uStack_6470 = auVar7._16_8_;
  uStack_6468 = auVar7._24_8_;
  puVar166 = in_RSI + (long)(in_R8D * 3) * 4;
  *puVar166 = local_6480;
  puVar166[1] = uStack_6478;
  puVar166[2] = uStack_6470;
  puVar166[3] = uStack_6468;
  local_66a0 = auVar23._0_8_;
  uStack_6698 = auVar23._8_8_;
  puVar166 = in_RSI + (long)(in_R8D * 0x1c) * 4;
  *puVar166 = local_66a0;
  puVar166[1] = uStack_6698;
  puVar166[2] = uStack_6a90;
  puVar166[3] = uStack_6688;
  local_6700 = auVar19._0_8_;
  uStack_66f8 = auVar19._8_8_;
  puVar166 = in_RSI + (long)(in_R8D * 4) * 4;
  *puVar166 = local_6700;
  puVar166[1] = uStack_66f8;
  puVar166[2] = uStack_6af0;
  puVar166[3] = uStack_66e8;
  local_6420 = auVar34._0_8_;
  uStack_6418 = auVar34._8_8_;
  uStack_6410 = auVar34._16_8_;
  uStack_6408 = auVar34._24_8_;
  puVar166 = in_RSI + (long)(in_R8D * 0x1b) * 4;
  *puVar166 = local_6420;
  puVar166[1] = uStack_6418;
  puVar166[2] = uStack_6410;
  puVar166[3] = uStack_6408;
  local_6500 = auVar8._0_8_;
  uStack_64f8 = auVar8._8_8_;
  uStack_64f0 = auVar8._16_8_;
  uStack_64e8 = auVar8._24_8_;
  puVar166 = in_RSI + (long)(in_R8D * 5) * 4;
  *puVar166 = local_6500;
  puVar166[1] = uStack_64f8;
  puVar166[2] = uStack_64f0;
  puVar166[3] = uStack_64e8;
  local_6620 = auVar16._0_8_;
  uStack_6618 = auVar16._8_8_;
  uStack_6610 = auVar16._16_8_;
  puVar166 = in_RSI + (long)(in_R8D * 0x1a) * 4;
  *puVar166 = local_6620;
  puVar166[1] = uStack_6618;
  puVar166[2] = uStack_6610;
  puVar166[3] = uStack_6a08;
  local_6600 = auVar33._0_8_;
  uStack_65f8 = auVar33._8_8_;
  uStack_65f0 = auVar33._16_8_;
  puVar166 = in_RSI + (long)(in_R8D * 6) * 4;
  *puVar166 = local_6600;
  puVar166[1] = uStack_65f8;
  puVar166[2] = uStack_65f0;
  puVar166[3] = uStack_69e8;
  local_6520 = auVar20._0_8_;
  uStack_6518 = auVar20._8_8_;
  uStack_6510 = auVar20._16_8_;
  uStack_6508 = auVar20._24_8_;
  puVar166 = in_RSI + (long)(in_R8D * 0x19) * 4;
  *puVar166 = local_6520;
  puVar166[1] = uStack_6518;
  puVar166[2] = uStack_6510;
  puVar166[3] = uStack_6508;
  local_6400 = auVar29._0_8_;
  uStack_63f8 = auVar29._8_8_;
  uStack_63f0 = auVar29._16_8_;
  uStack_63e8 = auVar29._24_8_;
  puVar166 = in_RSI + (long)(in_R8D * 7) * 4;
  *puVar166 = local_6400;
  puVar166[1] = uStack_63f8;
  puVar166[2] = uStack_63f0;
  puVar166[3] = uStack_63e8;
  local_6720 = auVar24._0_8_;
  uStack_6718 = auVar24._8_8_;
  puVar166 = in_RSI + (long)(in_R8D * 0x18) * 4;
  *puVar166 = local_6720;
  puVar166[1] = uStack_6718;
  puVar166[2] = uStack_6710;
  puVar166[3] = uStack_6b08;
  local_6740 = auVar4._0_8_;
  uStack_6738 = auVar4._8_8_;
  puVar166 = in_RSI + (long)(in_R8D * 8) * 4;
  *puVar166 = local_6740;
  puVar166[1] = uStack_6738;
  puVar166[2] = uStack_6730;
  puVar166[3] = uStack_6b28;
  local_63e0 = auVar25._0_8_;
  uStack_63d8 = auVar25._8_8_;
  uStack_63d0 = auVar25._16_8_;
  uStack_63c8 = auVar25._24_8_;
  puVar166 = in_RSI + (long)(in_R8D * 0x17) * 4;
  *puVar166 = local_63e0;
  puVar166[1] = uStack_63d8;
  puVar166[2] = uStack_63d0;
  puVar166[3] = uStack_63c8;
  local_6540 = auVar17._0_8_;
  uStack_6538 = auVar17._8_8_;
  uStack_6530 = auVar17._16_8_;
  uStack_6528 = auVar17._24_8_;
  puVar166 = in_RSI + (long)(in_R8D * 9) * 4;
  *puVar166 = local_6540;
  puVar166[1] = uStack_6538;
  puVar166[2] = uStack_6530;
  puVar166[3] = uStack_6528;
  local_65e0 = auVar32._0_8_;
  uStack_65d8 = auVar32._8_8_;
  uStack_65d0 = auVar32._16_8_;
  puVar166 = in_RSI + (long)(in_R8D * 0x16) * 4;
  *puVar166 = local_65e0;
  puVar166[1] = uStack_65d8;
  puVar166[2] = uStack_65d0;
  puVar166[3] = uStack_69c8;
  local_6640 = auVar13._0_8_;
  uStack_6638 = auVar13._8_8_;
  uStack_6630 = auVar13._16_8_;
  puVar166 = in_RSI + (long)(in_R8D * 10) * 4;
  *puVar166 = local_6640;
  puVar166[1] = uStack_6638;
  puVar166[2] = uStack_6630;
  puVar166[3] = uStack_6a28;
  local_64e0 = auVar9._0_8_;
  uStack_64d8 = auVar9._8_8_;
  uStack_64d0 = auVar9._16_8_;
  uStack_64c8 = auVar9._24_8_;
  puVar166 = in_RSI + (long)(in_R8D * 0x15) * 4;
  *puVar166 = local_64e0;
  puVar166[1] = uStack_64d8;
  puVar166[2] = uStack_64d0;
  puVar166[3] = uStack_64c8;
  local_6440 = auVar35._0_8_;
  uStack_6438 = auVar35._8_8_;
  uStack_6430 = auVar35._16_8_;
  uStack_6428 = auVar35._24_8_;
  puVar166 = in_RSI + (long)(in_R8D * 0xb) * 4;
  *puVar166 = local_6440;
  puVar166[1] = uStack_6438;
  puVar166[2] = uStack_6430;
  puVar166[3] = uStack_6428;
  local_66e0 = auVar3._0_8_;
  uStack_66d8 = auVar3._8_8_;
  puVar166 = in_RSI + (long)(in_R8D * 0x14) * 4;
  *puVar166 = local_66e0;
  puVar166[1] = uStack_66d8;
  puVar166[2] = uStack_6ad0;
  puVar166[3] = uStack_66c8;
  local_66c0 = auVar22._0_8_;
  uStack_66b8 = auVar22._8_8_;
  puVar166 = in_RSI + (long)(in_R8D * 0xc) * 4;
  *puVar166 = local_66c0;
  puVar166[1] = uStack_66b8;
  puVar166[2] = uStack_6ab0;
  puVar166[3] = uStack_66a8;
  local_6460 = auVar36._0_8_;
  uStack_6458 = auVar36._8_8_;
  uStack_6450 = auVar36._16_8_;
  uStack_6448 = auVar36._24_8_;
  puVar166 = in_RSI + (long)(in_R8D * 0x13) * 4;
  *puVar166 = local_6460;
  puVar166[1] = uStack_6458;
  puVar166[2] = uStack_6450;
  puVar166[3] = uStack_6448;
  local_64c0 = auVar12._0_8_;
  uStack_64b8 = auVar12._8_8_;
  uStack_64b0 = auVar12._16_8_;
  uStack_64a8 = auVar12._24_8_;
  puVar166 = in_RSI + (long)(in_R8D * 0xd) * 4;
  *puVar166 = local_64c0;
  puVar166[1] = uStack_64b8;
  puVar166[2] = uStack_64b0;
  puVar166[3] = uStack_64a8;
  local_6660 = auVar5._0_8_;
  uStack_6658 = auVar5._8_8_;
  uStack_6650 = auVar5._16_8_;
  puVar166 = in_RSI + (long)(in_R8D * 0x12) * 4;
  *puVar166 = local_6660;
  puVar166[1] = uStack_6658;
  puVar166[2] = uStack_6650;
  puVar166[3] = uStack_6a48;
  local_65c0 = auVar31._0_8_;
  uStack_65b8 = auVar31._8_8_;
  uStack_65b0 = auVar31._16_8_;
  puVar166 = in_RSI + (long)(in_R8D * 0xe) * 4;
  *puVar166 = local_65c0;
  puVar166[1] = uStack_65b8;
  puVar166[2] = uStack_65b0;
  puVar166[3] = uStack_69a8;
  local_6560 = auVar6._0_8_;
  uStack_6558 = auVar6._8_8_;
  uStack_6550 = auVar6._16_8_;
  uStack_6548 = auVar6._24_8_;
  puVar166 = in_RSI + (long)(in_R8D * 0x11) * 4;
  *puVar166 = local_6560;
  puVar166[1] = uStack_6558;
  puVar166[2] = uStack_6550;
  puVar166[3] = uStack_6548;
  local_63c0 = auVar26._0_8_;
  uStack_63b8 = auVar26._8_8_;
  uStack_63b0 = auVar26._16_8_;
  uStack_63a8 = auVar26._24_8_;
  puVar166 = in_RSI + (long)(in_R8D * 0xf) * 4;
  *puVar166 = local_63c0;
  puVar166[1] = uStack_63b8;
  puVar166[2] = uStack_63b0;
  puVar166[3] = uStack_63a8;
  local_6760 = auVar30._0_8_;
  uStack_6758 = auVar30._8_8_;
  puVar166 = in_RSI + (long)(in_R8D * 0x10) * 4;
  *puVar166 = local_6760;
  puVar166[1] = uStack_6758;
  puVar166[2] = uStack_6750;
  puVar166[3] = uStack_6b48;
  return;
}

Assistant:

static inline void fdct32_avx2(const __m256i *input, __m256i *output,
                               int8_t cos_bit) {
  __m256i x1[32];
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i _r = _mm256_set1_epi32(1 << (cos_bit - 1));
  // stage 0
  // stage 1
  btf_32_add_sub_out_avx2(&x1[0], &x1[31], input[0], input[31]);
  btf_32_add_sub_out_avx2(&x1[1], &x1[30], input[1], input[30]);
  btf_32_add_sub_out_avx2(&x1[2], &x1[29], input[2], input[29]);
  btf_32_add_sub_out_avx2(&x1[3], &x1[28], input[3], input[28]);
  btf_32_add_sub_out_avx2(&x1[4], &x1[27], input[4], input[27]);
  btf_32_add_sub_out_avx2(&x1[5], &x1[26], input[5], input[26]);
  btf_32_add_sub_out_avx2(&x1[6], &x1[25], input[6], input[25]);
  btf_32_add_sub_out_avx2(&x1[7], &x1[24], input[7], input[24]);
  btf_32_add_sub_out_avx2(&x1[8], &x1[23], input[8], input[23]);
  btf_32_add_sub_out_avx2(&x1[9], &x1[22], input[9], input[22]);
  btf_32_add_sub_out_avx2(&x1[10], &x1[21], input[10], input[21]);
  btf_32_add_sub_out_avx2(&x1[11], &x1[20], input[11], input[20]);
  btf_32_add_sub_out_avx2(&x1[12], &x1[19], input[12], input[19]);
  btf_32_add_sub_out_avx2(&x1[13], &x1[18], input[13], input[18]);
  btf_32_add_sub_out_avx2(&x1[14], &x1[17], input[14], input[17]);
  btf_32_add_sub_out_avx2(&x1[15], &x1[16], input[15], input[16]);

  // stage 2
  btf_32_add_sub_avx2(&x1[0], &x1[15]);
  btf_32_add_sub_avx2(&x1[1], &x1[14]);
  btf_32_add_sub_avx2(&x1[2], &x1[13]);
  btf_32_add_sub_avx2(&x1[3], &x1[12]);
  btf_32_add_sub_avx2(&x1[4], &x1[11]);
  btf_32_add_sub_avx2(&x1[5], &x1[10]);
  btf_32_add_sub_avx2(&x1[6], &x1[9]);
  btf_32_add_sub_avx2(&x1[7], &x1[8]);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[20], &x1[27], _r, cos_bit);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[21], &x1[26], _r, cos_bit);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[22], &x1[25], _r, cos_bit);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[23], &x1[24], _r, cos_bit);

  // stage 3
  btf_32_add_sub_avx2(&x1[0], &x1[7]);
  btf_32_add_sub_avx2(&x1[1], &x1[6]);
  btf_32_add_sub_avx2(&x1[2], &x1[5]);
  btf_32_add_sub_avx2(&x1[3], &x1[4]);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[10], &x1[13], _r, cos_bit);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[11], &x1[12], _r, cos_bit);
  btf_32_add_sub_avx2(&x1[16], &x1[23]);
  btf_32_add_sub_avx2(&x1[17], &x1[22]);
  btf_32_add_sub_avx2(&x1[18], &x1[21]);
  btf_32_add_sub_avx2(&x1[19], &x1[20]);
  btf_32_add_sub_avx2(&x1[31], &x1[24]);
  btf_32_add_sub_avx2(&x1[30], &x1[25]);
  btf_32_add_sub_avx2(&x1[29], &x1[26]);
  btf_32_add_sub_avx2(&x1[28], &x1[27]);

  // stage 4
  btf_32_add_sub_avx2(&x1[0], &x1[3]);
  btf_32_add_sub_avx2(&x1[1], &x1[2]);
  btf_32_avx2_type0(-cospi[32], cospi[32], &x1[5], &x1[6], _r, cos_bit);
  btf_32_add_sub_avx2(&x1[8], &x1[11]);
  btf_32_add_sub_avx2(&x1[9], &x1[10]);
  btf_32_add_sub_avx2(&x1[15], &x1[12]);
  btf_32_add_sub_avx2(&x1[14], &x1[13]);
  btf_32_avx2_type0(-cospi[16], cospi[48], &x1[18], &x1[29], _r, cos_bit);
  btf_32_avx2_type0(-cospi[16], cospi[48], &x1[19], &x1[28], _r, cos_bit);
  btf_32_avx2_type0(-cospi[48], -cospi[16], &x1[20], &x1[27], _r, cos_bit);
  btf_32_avx2_type0(-cospi[48], -cospi[16], &x1[21], &x1[26], _r, cos_bit);

  // stage 5
  btf_32_avx2_type0(cospi[32], cospi[32], &x1[0], &x1[1], _r, cos_bit);
  btf_32_avx2_type1(cospi[48], cospi[16], &x1[2], &x1[3], _r, cos_bit);
  btf_32_add_sub_avx2(&x1[4], &x1[5]);
  btf_32_add_sub_avx2(&x1[7], &x1[6]);
  btf_32_avx2_type0(-cospi[16], cospi[48], &x1[9], &x1[14], _r, cos_bit);
  btf_32_avx2_type0(-cospi[48], -cospi[16], &x1[10], &x1[13], _r, cos_bit);
  btf_32_add_sub_avx2(&x1[16], &x1[19]);
  btf_32_add_sub_avx2(&x1[17], &x1[18]);
  btf_32_add_sub_avx2(&x1[23], &x1[20]);
  btf_32_add_sub_avx2(&x1[22], &x1[21]);
  btf_32_add_sub_avx2(&x1[24], &x1[27]);
  btf_32_add_sub_avx2(&x1[25], &x1[26]);
  btf_32_add_sub_avx2(&x1[31], &x1[28]);
  btf_32_add_sub_avx2(&x1[30], &x1[29]);

  // stage 6
  btf_32_avx2_type1(cospi[56], cospi[8], &x1[4], &x1[7], _r, cos_bit);
  btf_32_avx2_type1(cospi[24], cospi[40], &x1[5], &x1[6], _r, cos_bit);
  btf_32_add_sub_avx2(&x1[8], &x1[9]);
  btf_32_add_sub_avx2(&x1[11], &x1[10]);
  btf_32_add_sub_avx2(&x1[12], &x1[13]);
  btf_32_add_sub_avx2(&x1[15], &x1[14]);
  btf_32_avx2_type0(-cospi[8], cospi[56], &x1[17], &x1[30], _r, cos_bit);
  btf_32_avx2_type0(-cospi[56], -cospi[8], &x1[18], &x1[29], _r, cos_bit);
  btf_32_avx2_type0(-cospi[40], cospi[24], &x1[21], &x1[26], _r, cos_bit);
  btf_32_avx2_type0(-cospi[24], -cospi[40], &x1[22], &x1[25], _r, cos_bit);

  // stage 7
  btf_32_avx2_type1(cospi[60], cospi[4], &x1[8], &x1[15], _r, cos_bit);
  btf_32_avx2_type1(cospi[28], cospi[36], &x1[9], &x1[14], _r, cos_bit);
  btf_32_avx2_type1(cospi[44], cospi[20], &x1[10], &x1[13], _r, cos_bit);
  btf_32_avx2_type1(cospi[12], cospi[52], &x1[11], &x1[12], _r, cos_bit);
  btf_32_add_sub_avx2(&x1[16], &x1[17]);
  btf_32_add_sub_avx2(&x1[19], &x1[18]);
  btf_32_add_sub_avx2(&x1[20], &x1[21]);
  btf_32_add_sub_avx2(&x1[23], &x1[22]);
  btf_32_add_sub_avx2(&x1[24], &x1[25]);
  btf_32_add_sub_avx2(&x1[27], &x1[26]);
  btf_32_add_sub_avx2(&x1[28], &x1[29]);
  btf_32_add_sub_avx2(&x1[31], &x1[30]);

  // stage 8
  btf_32_avx2_type1(cospi[62], cospi[2], &x1[16], &x1[31], _r, cos_bit);
  btf_32_avx2_type1(cospi[30], cospi[34], &x1[17], &x1[30], _r, cos_bit);
  btf_32_avx2_type1(cospi[46], cospi[18], &x1[18], &x1[29], _r, cos_bit);
  btf_32_avx2_type1(cospi[14], cospi[50], &x1[19], &x1[28], _r, cos_bit);
  btf_32_avx2_type1(cospi[54], cospi[10], &x1[20], &x1[27], _r, cos_bit);
  btf_32_avx2_type1(cospi[22], cospi[42], &x1[21], &x1[26], _r, cos_bit);
  btf_32_avx2_type1(cospi[38], cospi[26], &x1[22], &x1[25], _r, cos_bit);
  btf_32_avx2_type1(cospi[6], cospi[58], &x1[23], &x1[24], _r, cos_bit);

  // stage 9
  output[0] = x1[0];
  output[1] = x1[16];
  output[2] = x1[8];
  output[3] = x1[24];
  output[4] = x1[4];
  output[5] = x1[20];
  output[6] = x1[12];
  output[7] = x1[28];
  output[8] = x1[2];
  output[9] = x1[18];
  output[10] = x1[10];
  output[11] = x1[26];
  output[12] = x1[6];
  output[13] = x1[22];
  output[14] = x1[14];
  output[15] = x1[30];
  output[16] = x1[1];
  output[17] = x1[17];
  output[18] = x1[9];
  output[19] = x1[25];
  output[20] = x1[5];
  output[21] = x1[21];
  output[22] = x1[13];
  output[23] = x1[29];
  output[24] = x1[3];
  output[25] = x1[19];
  output[26] = x1[11];
  output[27] = x1[27];
  output[28] = x1[7];
  output[29] = x1[23];
  output[30] = x1[15];
  output[31] = x1[31];
}